

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  bool bVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  undefined8 unaff_RBP;
  ulong uVar31;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar52 [16];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  float fVar94;
  undefined4 uVar95;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  float t1;
  undefined1 auVar104 [16];
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  vfloat4 a0_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  vfloat4 a0_3;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  __m128 a_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  __m128 a;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar197;
  float fVar198;
  vfloat4 a0_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar199;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar211;
  float fVar212;
  vfloat4 a0;
  undefined1 auVar204 [16];
  float fVar213;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_340;
  float local_33c;
  undefined1 local_338 [16];
  long local_328;
  Primitive *local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  RayQueryContext *local_260;
  Precalculations *local_258;
  ulong local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  undefined4 local_180;
  undefined8 local_17c;
  undefined4 local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar27;
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar221 [32];
  
  uVar26 = (ulong)(byte)prim[1];
  fVar202 = *(float *)(prim + uVar26 * 0x19 + 0x12);
  auVar75._16_16_ =
       vsubps_avx((undefined1  [16])(ray->org).field_0,
                  *(undefined1 (*) [16])(prim + uVar26 * 0x19 + 6));
  fVar105 = fVar202 * auVar75._16_4_;
  fVar94 = fVar202 * (ray->dir).field_0.m128[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar26 * 4 + 6);
  auVar63 = vpmovsxbd_avx2(auVar37);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar26 * 5 + 6);
  auVar61 = vpmovsxbd_avx2(auVar46);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar26 * 6 + 6);
  auVar68 = vpmovsxbd_avx2(auVar47);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar78 = vpmovsxbd_avx2(auVar48);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar26 * 0xc + 6);
  auVar79 = vpmovsxbd_avx2(auVar42);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar26 * 0xd + 6);
  auVar62 = vpmovsxbd_avx2(auVar38);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar26 * 0x12 + 6);
  auVar69 = vpmovsxbd_avx2(auVar39);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar26 * 0x13 + 6);
  auVar70 = vpmovsxbd_avx2(auVar40);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar26 * 0x14 + 6);
  auVar72 = vpmovsxbd_avx2(auVar41);
  auVar71 = vcvtdq2ps_avx(auVar72);
  auVar133._4_4_ = fVar94;
  auVar133._0_4_ = fVar94;
  auVar133._8_4_ = fVar94;
  auVar133._12_4_ = fVar94;
  auVar133._16_4_ = fVar94;
  auVar133._20_4_ = fVar94;
  auVar133._24_4_ = fVar94;
  auVar133._28_4_ = fVar94;
  auVar227._8_4_ = 1;
  auVar227._0_8_ = 0x100000001;
  auVar227._12_4_ = 1;
  auVar227._16_4_ = 1;
  auVar227._20_4_ = 1;
  auVar227._24_4_ = 1;
  auVar227._28_4_ = 1;
  auVar58 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar60 = ZEXT1632(CONCAT412(fVar202 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar202 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar202 * (ray->dir).field_0.m128[1],fVar94))));
  auVar73 = vpermps_avx2(auVar227,auVar60);
  auVar59 = vpermps_avx512vl(auVar58,auVar60);
  fVar94 = auVar59._0_4_;
  auVar228._0_4_ = fVar94 * auVar68._0_4_;
  fVar197 = auVar59._4_4_;
  auVar228._4_4_ = fVar197 * auVar68._4_4_;
  fVar198 = auVar59._8_4_;
  auVar228._8_4_ = fVar198 * auVar68._8_4_;
  fVar199 = auVar59._12_4_;
  auVar228._12_4_ = fVar199 * auVar68._12_4_;
  fVar200 = auVar59._16_4_;
  auVar228._16_4_ = fVar200 * auVar68._16_4_;
  fVar201 = auVar59._20_4_;
  auVar228._20_4_ = fVar201 * auVar68._20_4_;
  fVar103 = auVar59._24_4_;
  auVar228._28_36_ = in_ZMM4._28_36_;
  auVar228._24_4_ = fVar103 * auVar68._24_4_;
  auVar60._4_4_ = auVar62._4_4_ * fVar197;
  auVar60._0_4_ = auVar62._0_4_ * fVar94;
  auVar60._8_4_ = auVar62._8_4_ * fVar198;
  auVar60._12_4_ = auVar62._12_4_ * fVar199;
  auVar60._16_4_ = auVar62._16_4_ * fVar200;
  auVar60._20_4_ = auVar62._20_4_ * fVar201;
  auVar60._24_4_ = auVar62._24_4_ * fVar103;
  auVar60._28_4_ = auVar72._28_4_;
  auVar72._4_4_ = auVar71._4_4_ * fVar197;
  auVar72._0_4_ = auVar71._0_4_ * fVar94;
  auVar72._8_4_ = auVar71._8_4_ * fVar198;
  auVar72._12_4_ = auVar71._12_4_ * fVar199;
  auVar72._16_4_ = auVar71._16_4_ * fVar200;
  auVar72._20_4_ = auVar71._20_4_ * fVar201;
  auVar72._24_4_ = auVar71._24_4_ * fVar103;
  auVar72._28_4_ = auVar59._28_4_;
  auVar37 = vfmadd231ps_fma(auVar228._0_32_,auVar73,auVar61);
  auVar46 = vfmadd231ps_fma(auVar60,auVar73,auVar79);
  auVar47 = vfmadd231ps_fma(auVar72,auVar70,auVar73);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar133,auVar63);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar133,auVar78);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar69,auVar133);
  auVar217._4_4_ = fVar105;
  auVar217._0_4_ = fVar105;
  auVar217._8_4_ = fVar105;
  auVar217._12_4_ = fVar105;
  auVar217._16_4_ = fVar105;
  auVar217._20_4_ = fVar105;
  auVar217._24_4_ = fVar105;
  auVar217._28_4_ = fVar105;
  auVar73 = ZEXT1632(CONCAT412(fVar202 * auVar75._28_4_,
                               CONCAT48(fVar202 * auVar75._24_4_,
                                        CONCAT44(fVar202 * auVar75._20_4_,fVar105))));
  auVar72 = vpermps_avx2(auVar227,auVar73);
  auVar60 = vpermps_avx512vl(auVar58,auVar73);
  fVar202 = auVar60._0_4_;
  fVar94 = auVar60._4_4_;
  auVar73._4_4_ = fVar94 * auVar68._4_4_;
  auVar73._0_4_ = fVar202 * auVar68._0_4_;
  fVar197 = auVar60._8_4_;
  auVar73._8_4_ = fVar197 * auVar68._8_4_;
  fVar198 = auVar60._12_4_;
  auVar73._12_4_ = fVar198 * auVar68._12_4_;
  fVar199 = auVar60._16_4_;
  auVar73._16_4_ = fVar199 * auVar68._16_4_;
  fVar200 = auVar60._20_4_;
  auVar73._20_4_ = fVar200 * auVar68._20_4_;
  fVar201 = auVar60._24_4_;
  auVar73._24_4_ = fVar201 * auVar68._24_4_;
  auVar73._28_4_ = 1;
  auVar58._4_4_ = auVar62._4_4_ * fVar94;
  auVar58._0_4_ = auVar62._0_4_ * fVar202;
  auVar58._8_4_ = auVar62._8_4_ * fVar197;
  auVar58._12_4_ = auVar62._12_4_ * fVar198;
  auVar58._16_4_ = auVar62._16_4_ * fVar199;
  auVar58._20_4_ = auVar62._20_4_ * fVar200;
  auVar58._24_4_ = auVar62._24_4_ * fVar201;
  auVar58._28_4_ = auVar68._28_4_;
  auVar62._4_4_ = auVar71._4_4_ * fVar94;
  auVar62._0_4_ = auVar71._0_4_ * fVar202;
  auVar62._8_4_ = auVar71._8_4_ * fVar197;
  auVar62._12_4_ = auVar71._12_4_ * fVar198;
  auVar62._16_4_ = auVar71._16_4_ * fVar199;
  auVar62._20_4_ = auVar71._20_4_ * fVar200;
  auVar62._24_4_ = auVar71._24_4_ * fVar201;
  auVar62._28_4_ = auVar60._28_4_;
  auVar48 = vfmadd231ps_fma(auVar73,auVar72,auVar61);
  auVar42 = vfmadd231ps_fma(auVar58,auVar72,auVar79);
  auVar38 = vfmadd231ps_fma(auVar62,auVar72,auVar70);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar217,auVar63);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar217,auVar78);
  auVar81._8_4_ = 0x7fffffff;
  auVar81._0_8_ = 0x7fffffff7fffffff;
  auVar81._12_4_ = 0x7fffffff;
  auVar81._16_4_ = 0x7fffffff;
  auVar81._20_4_ = 0x7fffffff;
  auVar81._24_4_ = 0x7fffffff;
  auVar81._28_4_ = 0x7fffffff;
  auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar217,auVar69);
  auVar63 = vandps_avx(ZEXT1632(auVar37),auVar81);
  auVar122._8_4_ = 0x219392ef;
  auVar122._0_8_ = 0x219392ef219392ef;
  auVar122._12_4_ = 0x219392ef;
  auVar122._16_4_ = 0x219392ef;
  auVar122._20_4_ = 0x219392ef;
  auVar122._24_4_ = 0x219392ef;
  auVar122._28_4_ = 0x219392ef;
  uVar31 = vcmpps_avx512vl(auVar63,auVar122,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar59._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar37._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar37._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar37._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar37._12_4_;
  auVar59._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar59._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar59._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar59._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar63 = vandps_avx(ZEXT1632(auVar46),auVar81);
  uVar31 = vcmpps_avx512vl(auVar63,auVar122,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar74._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar63 = vandps_avx(ZEXT1632(auVar47),auVar81);
  uVar31 = vcmpps_avx512vl(auVar63,auVar122,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar63._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._12_4_;
  auVar63._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar63._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar63._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar63._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar61 = vrcp14ps_avx512vl(auVar59);
  auVar82._8_4_ = 0x3f800000;
  auVar82._0_8_ = 0x3f8000003f800000;
  auVar82._12_4_ = 0x3f800000;
  auVar82._16_4_ = 0x3f800000;
  auVar82._20_4_ = 0x3f800000;
  auVar82._24_4_ = 0x3f800000;
  auVar82._28_4_ = 0x3f800000;
  auVar37 = vfnmadd213ps_fma(auVar59,auVar61,auVar82);
  auVar37 = vfmadd132ps_fma(ZEXT1632(auVar37),auVar61,auVar61);
  auVar61 = vrcp14ps_avx512vl(auVar74);
  auVar46 = vfnmadd213ps_fma(auVar74,auVar61,auVar82);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar61,auVar61);
  auVar61 = vrcp14ps_avx512vl(auVar63);
  auVar47 = vfnmadd213ps_fma(auVar63,auVar61,auVar82);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar61,auVar61);
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 7 + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar48));
  auVar69._4_4_ = auVar37._4_4_ * auVar63._4_4_;
  auVar69._0_4_ = auVar37._0_4_ * auVar63._0_4_;
  auVar69._8_4_ = auVar37._8_4_ * auVar63._8_4_;
  auVar69._12_4_ = auVar37._12_4_ * auVar63._12_4_;
  auVar69._16_4_ = auVar63._16_4_ * 0.0;
  auVar69._20_4_ = auVar63._20_4_ * 0.0;
  auVar69._24_4_ = auVar63._24_4_ * 0.0;
  auVar69._28_4_ = auVar63._28_4_;
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 9 + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar48));
  auVar80._0_4_ = auVar37._0_4_ * auVar63._0_4_;
  auVar80._4_4_ = auVar37._4_4_ * auVar63._4_4_;
  auVar80._8_4_ = auVar37._8_4_ * auVar63._8_4_;
  auVar80._12_4_ = auVar37._12_4_ * auVar63._12_4_;
  auVar80._16_4_ = auVar63._16_4_ * 0.0;
  auVar80._20_4_ = auVar63._20_4_ * 0.0;
  auVar80._24_4_ = auVar63._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0xe + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar42));
  auVar70._4_4_ = auVar46._4_4_ * auVar63._4_4_;
  auVar70._0_4_ = auVar46._0_4_ * auVar63._0_4_;
  auVar70._8_4_ = auVar46._8_4_ * auVar63._8_4_;
  auVar70._12_4_ = auVar46._12_4_ * auVar63._12_4_;
  auVar70._16_4_ = auVar63._16_4_ * 0.0;
  auVar70._20_4_ = auVar63._20_4_ * 0.0;
  auVar70._24_4_ = auVar63._24_4_ * 0.0;
  auVar70._28_4_ = auVar63._28_4_;
  auVar62 = vpbroadcastd_avx512vl();
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar42));
  auVar77._0_4_ = auVar46._0_4_ * auVar63._0_4_;
  auVar77._4_4_ = auVar46._4_4_ * auVar63._4_4_;
  auVar77._8_4_ = auVar46._8_4_ * auVar63._8_4_;
  auVar77._12_4_ = auVar46._12_4_ * auVar63._12_4_;
  auVar77._16_4_ = auVar63._16_4_ * 0.0;
  auVar77._20_4_ = auVar63._20_4_ * 0.0;
  auVar77._24_4_ = auVar63._24_4_ * 0.0;
  auVar77._28_4_ = 0;
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x15 + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar38));
  auVar71._4_4_ = auVar63._4_4_ * auVar47._4_4_;
  auVar71._0_4_ = auVar63._0_4_ * auVar47._0_4_;
  auVar71._8_4_ = auVar63._8_4_ * auVar47._8_4_;
  auVar71._12_4_ = auVar63._12_4_ * auVar47._12_4_;
  auVar71._16_4_ = auVar63._16_4_ * 0.0;
  auVar71._20_4_ = auVar63._20_4_ * 0.0;
  auVar71._24_4_ = auVar63._24_4_ * 0.0;
  auVar71._28_4_ = auVar63._28_4_;
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x17 + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar38));
  auVar76._0_4_ = auVar47._0_4_ * auVar63._0_4_;
  auVar76._4_4_ = auVar47._4_4_ * auVar63._4_4_;
  auVar76._8_4_ = auVar47._8_4_ * auVar63._8_4_;
  auVar76._12_4_ = auVar47._12_4_ * auVar63._12_4_;
  auVar76._16_4_ = auVar63._16_4_ * 0.0;
  auVar76._20_4_ = auVar63._20_4_ * 0.0;
  auVar76._24_4_ = auVar63._24_4_ * 0.0;
  auVar76._28_4_ = 0;
  auVar63 = vpminsd_avx2(auVar69,auVar80);
  auVar61 = vpminsd_avx2(auVar70,auVar77);
  auVar63 = vmaxps_avx(auVar63,auVar61);
  auVar61 = vpminsd_avx2(auVar71,auVar76);
  uVar95 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar68._4_4_ = uVar95;
  auVar68._0_4_ = uVar95;
  auVar68._8_4_ = uVar95;
  auVar68._12_4_ = uVar95;
  auVar68._16_4_ = uVar95;
  auVar68._20_4_ = uVar95;
  auVar68._24_4_ = uVar95;
  auVar68._28_4_ = uVar95;
  auVar61 = vmaxps_avx512vl(auVar61,auVar68);
  auVar63 = vmaxps_avx(auVar63,auVar61);
  auVar61._8_4_ = 0x3f7ffffa;
  auVar61._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar61._12_4_ = 0x3f7ffffa;
  auVar61._16_4_ = 0x3f7ffffa;
  auVar61._20_4_ = 0x3f7ffffa;
  auVar61._24_4_ = 0x3f7ffffa;
  auVar61._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar63,auVar61);
  auVar63 = vpmaxsd_avx2(auVar69,auVar80);
  auVar61 = vpmaxsd_avx2(auVar70,auVar77);
  auVar63 = vminps_avx(auVar63,auVar61);
  auVar61 = vpmaxsd_avx2(auVar71,auVar76);
  fVar202 = ray->tfar;
  auVar78._4_4_ = fVar202;
  auVar78._0_4_ = fVar202;
  auVar78._8_4_ = fVar202;
  auVar78._12_4_ = fVar202;
  auVar78._16_4_ = fVar202;
  auVar78._20_4_ = fVar202;
  auVar78._24_4_ = fVar202;
  auVar78._28_4_ = fVar202;
  auVar61 = vminps_avx512vl(auVar61,auVar78);
  auVar63 = vminps_avx(auVar63,auVar61);
  auVar79._8_4_ = 0x3f800003;
  auVar79._0_8_ = 0x3f8000033f800003;
  auVar79._12_4_ = 0x3f800003;
  auVar79._16_4_ = 0x3f800003;
  auVar79._20_4_ = 0x3f800003;
  auVar79._24_4_ = 0x3f800003;
  auVar79._28_4_ = 0x3f800003;
  auVar63 = vmulps_avx512vl(auVar63,auVar79);
  uVar11 = vcmpps_avx512vl(local_78,auVar63,2);
  uVar12 = vpcmpgtd_avx512vl(auVar62,_DAT_01fb4ba0);
  uVar31 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)(byte)((byte)uVar11 & (byte)uVar12));
  auVar75._16_16_ = auVar63._16_16_;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar239 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar228 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar229 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar230 = ZEXT1664(auVar37);
  auVar238 = ZEXT464(0x3f800000);
  local_258 = pre;
LAB_01a29eae:
  if (uVar31 == 0) {
LAB_01a2b8e3:
    return uVar31 != 0;
  }
  lVar28 = 0;
  for (uVar26 = uVar31; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  local_250 = (ulong)*(uint *)(prim + lVar28 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_250 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar37 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar26);
  lVar28 = uVar26 + 1;
  auVar46 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar28);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar47 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar26);
  auVar48 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar28);
  auVar57 = auVar239._0_16_;
  auVar38 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar26),
                       auVar37,auVar57);
  auVar39 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar28),
                       auVar46,auVar57);
  auVar40 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar26 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar47,auVar57);
  auVar41 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar28),
                       auVar48,auVar57);
  auVar65._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar42 = vmulps_avx512vl(auVar46,auVar65._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar39,auVar65._0_16_);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar38,auVar43);
  auVar53._0_4_ = auVar37._0_4_ + auVar42._0_4_;
  auVar53._4_4_ = auVar37._4_4_ + auVar42._4_4_;
  auVar53._8_4_ = auVar37._8_4_ + auVar42._8_4_;
  auVar53._12_4_ = auVar37._12_4_ + auVar42._12_4_;
  auVar51 = auVar228._0_16_;
  auVar42 = vfmadd231ps_avx512vl(auVar43,auVar38,auVar51);
  auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar37,auVar51);
  auVar42 = vmulps_avx512vl(auVar48,auVar65._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar42,auVar41,auVar65._0_16_);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar40,auVar44);
  auVar204._0_4_ = auVar47._0_4_ + auVar42._0_4_;
  auVar204._4_4_ = auVar47._4_4_ + auVar42._4_4_;
  auVar204._8_4_ = auVar47._8_4_ + auVar42._8_4_;
  auVar204._12_4_ = auVar47._12_4_ + auVar42._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar44,auVar40,auVar51);
  auVar44 = vfnmadd231ps_avx512vl(auVar42,auVar47,auVar51);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar39,auVar46);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar38,auVar65._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar42,auVar37,auVar65._0_16_);
  auVar46 = vmulps_avx512vl(auVar46,auVar51);
  auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar51,auVar39);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar65._0_16_,auVar38);
  auVar39 = vfnmadd231ps_avx512vl(auVar46,auVar65._0_16_,auVar37);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar41,auVar48);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar40,auVar65._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar37,auVar47,auVar65._0_16_);
  auVar37 = vmulps_avx512vl(auVar48,auVar51);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar51,auVar41);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar65._0_16_,auVar40);
  auVar38 = vfnmadd231ps_avx512vl(auVar37,auVar65._0_16_,auVar47);
  auVar37 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar46 = vshufps_avx(auVar204,auVar204,0xc9);
  fVar105 = auVar43._0_4_;
  auVar136._0_4_ = fVar105 * auVar46._0_4_;
  fVar100 = auVar43._4_4_;
  auVar136._4_4_ = fVar100 * auVar46._4_4_;
  fVar101 = auVar43._8_4_;
  auVar136._8_4_ = fVar101 * auVar46._8_4_;
  fVar102 = auVar43._12_4_;
  auVar136._12_4_ = fVar102 * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar136,auVar37,auVar204);
  auVar47 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar154._0_4_ = auVar46._0_4_ * fVar105;
  auVar154._4_4_ = auVar46._4_4_ * fVar100;
  auVar154._8_4_ = auVar46._8_4_ * fVar101;
  auVar154._12_4_ = auVar46._12_4_ * fVar102;
  auVar37 = vfmsub231ps_fma(auVar154,auVar37,auVar44);
  auVar48 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar46 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar202 = auVar39._0_4_;
  auVar163._0_4_ = auVar46._0_4_ * fVar202;
  fVar94 = auVar39._4_4_;
  auVar163._4_4_ = auVar46._4_4_ * fVar94;
  fVar197 = auVar39._8_4_;
  auVar163._8_4_ = auVar46._8_4_ * fVar197;
  fVar198 = auVar39._12_4_;
  auVar163._12_4_ = auVar46._12_4_ * fVar198;
  auVar46 = vfmsub231ps_fma(auVar163,auVar37,auVar42);
  auVar42 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar164._0_4_ = auVar46._0_4_ * fVar202;
  auVar164._4_4_ = auVar46._4_4_ * fVar94;
  auVar164._8_4_ = auVar46._8_4_ * fVar197;
  auVar164._12_4_ = auVar46._12_4_ * fVar198;
  auVar37 = vfmsub231ps_fma(auVar164,auVar37,auVar38);
  auVar38 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vdpps_avx(auVar47,auVar47,0x7f);
  fVar199 = auVar37._0_4_;
  auVar65._16_16_ = auVar75._16_16_;
  auVar64._4_28_ = auVar65._4_28_;
  auVar64._0_4_ = fVar199;
  auVar46 = vrsqrt14ss_avx512f(auVar65._0_16_,auVar64._0_16_);
  fVar200 = auVar46._0_4_;
  fVar201 = fVar200 * 1.5 - fVar199 * 0.5 * fVar200 * fVar200 * fVar200;
  auVar46 = vdpps_avx(auVar47,auVar48,0x7f);
  fVar203 = fVar201 * auVar47._0_4_;
  fVar211 = fVar201 * auVar47._4_4_;
  fVar212 = fVar201 * auVar47._8_4_;
  fVar213 = fVar201 * auVar47._12_4_;
  auVar155._0_4_ = fVar199 * auVar48._0_4_;
  auVar155._4_4_ = fVar199 * auVar48._4_4_;
  auVar155._8_4_ = fVar199 * auVar48._8_4_;
  auVar155._12_4_ = fVar199 * auVar48._12_4_;
  fVar199 = auVar46._0_4_;
  auVar137._0_4_ = fVar199 * auVar47._0_4_;
  auVar137._4_4_ = fVar199 * auVar47._4_4_;
  auVar137._8_4_ = fVar199 * auVar47._8_4_;
  auVar137._12_4_ = fVar199 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar155,auVar137);
  auVar46 = vrcp14ss_avx512f(auVar65._0_16_,auVar64._0_16_);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar46,ZEXT416(0x40000000));
  fVar199 = auVar46._0_4_ * auVar37._0_4_;
  auVar37 = vdpps_avx(auVar42,auVar42,0x7f);
  fVar200 = auVar37._0_4_;
  auVar67._16_16_ = auVar75._16_16_;
  auVar67._0_16_ = auVar65._0_16_;
  auVar66._4_28_ = auVar67._4_28_;
  auVar66._0_4_ = fVar200;
  auVar46 = vrsqrt14ss_avx512f(auVar65._0_16_,auVar66._0_16_);
  fVar103 = auVar46._0_4_;
  fVar103 = fVar103 * 1.5 - fVar200 * 0.5 * fVar103 * fVar103 * fVar103;
  fVar176 = fVar103 * auVar42._0_4_;
  fVar184 = fVar103 * auVar42._4_4_;
  fVar185 = fVar103 * auVar42._8_4_;
  fVar186 = fVar103 * auVar42._12_4_;
  auVar46 = vdpps_avx(auVar42,auVar38,0x7f);
  auVar124._0_4_ = fVar200 * auVar38._0_4_;
  auVar124._4_4_ = fVar200 * auVar38._4_4_;
  auVar124._8_4_ = fVar200 * auVar38._8_4_;
  auVar124._12_4_ = fVar200 * auVar38._12_4_;
  fVar200 = auVar46._0_4_;
  auVar55._0_4_ = fVar200 * auVar42._0_4_;
  auVar55._4_4_ = fVar200 * auVar42._4_4_;
  auVar55._8_4_ = fVar200 * auVar42._8_4_;
  auVar55._12_4_ = fVar200 * auVar42._12_4_;
  auVar48 = vsubps_avx(auVar124,auVar55);
  auVar46 = vrcp14ss_avx512f(auVar65._0_16_,auVar66._0_16_);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar46,ZEXT416(0x40000000));
  fVar200 = auVar46._0_4_ * auVar37._0_4_;
  auVar37 = vshufps_avx(auVar53,auVar53,0xff);
  auVar146._0_4_ = fVar203 * auVar37._0_4_;
  auVar146._4_4_ = fVar211 * auVar37._4_4_;
  auVar146._8_4_ = fVar212 * auVar37._8_4_;
  auVar146._12_4_ = fVar213 * auVar37._12_4_;
  local_1a8 = vsubps_avx(auVar53,auVar146);
  auVar46 = vshufps_avx(auVar43,auVar43,0xff);
  auVar125._0_4_ = auVar46._0_4_ * fVar203 + auVar37._0_4_ * fVar201 * fVar199 * auVar47._0_4_;
  auVar125._4_4_ = auVar46._4_4_ * fVar211 + auVar37._4_4_ * fVar201 * fVar199 * auVar47._4_4_;
  auVar125._8_4_ = auVar46._8_4_ * fVar212 + auVar37._8_4_ * fVar201 * fVar199 * auVar47._8_4_;
  auVar125._12_4_ = auVar46._12_4_ * fVar213 + auVar37._12_4_ * fVar201 * fVar199 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar43,auVar125);
  local_1b8._0_4_ = auVar53._0_4_ + auVar146._0_4_;
  local_1b8._4_4_ = auVar53._4_4_ + auVar146._4_4_;
  fStack_1b0 = auVar53._8_4_ + auVar146._8_4_;
  fStack_1ac = auVar53._12_4_ + auVar146._12_4_;
  auVar44._0_4_ = fVar105 + auVar125._0_4_;
  auVar44._4_4_ = fVar100 + auVar125._4_4_;
  auVar44._8_4_ = fVar101 + auVar125._8_4_;
  auVar44._12_4_ = fVar102 + auVar125._12_4_;
  auVar37 = vshufps_avx(auVar45,auVar45,0xff);
  auVar126._0_4_ = fVar176 * auVar37._0_4_;
  auVar126._4_4_ = fVar184 * auVar37._4_4_;
  auVar126._8_4_ = fVar185 * auVar37._8_4_;
  auVar126._12_4_ = fVar186 * auVar37._12_4_;
  local_1c8 = vsubps_avx(auVar45,auVar126);
  auVar46 = vshufps_avx(auVar39,auVar39,0xff);
  auVar51._0_4_ = fVar176 * auVar46._0_4_ + auVar37._0_4_ * fVar103 * auVar48._0_4_ * fVar200;
  auVar51._4_4_ = fVar184 * auVar46._4_4_ + auVar37._4_4_ * fVar103 * auVar48._4_4_ * fVar200;
  auVar51._8_4_ = fVar185 * auVar46._8_4_ + auVar37._8_4_ * fVar103 * auVar48._8_4_ * fVar200;
  auVar51._12_4_ = fVar186 * auVar46._12_4_ + auVar37._12_4_ * fVar103 * auVar48._12_4_ * fVar200;
  auVar37 = vsubps_avx(auVar39,auVar51);
  _local_1d8 = vaddps_avx512vl(auVar45,auVar126);
  auVar52._0_4_ = fVar202 + auVar51._0_4_;
  auVar52._4_4_ = fVar94 + auVar51._4_4_;
  auVar52._8_4_ = fVar197 + auVar51._8_4_;
  auVar52._12_4_ = fVar198 + auVar51._12_4_;
  auVar46 = vmulps_avx512vl(auVar47,auVar57);
  local_1e8 = vaddps_avx512vl(local_1a8,auVar46);
  auVar37 = vmulps_avx512vl(auVar37,auVar57);
  local_1f8 = vsubps_avx512vl(local_1c8,auVar37);
  auVar37 = vmulps_avx512vl(auVar44,auVar57);
  _local_208 = vaddps_avx512vl(_local_1b8,auVar37);
  auVar37 = vmulps_avx512vl(auVar52,auVar57);
  _local_218 = vsubps_avx512vl(_local_1d8,auVar37);
  aVar2 = (ray->org).field_0;
  auVar46 = vsubps_avx(local_1a8,(undefined1  [16])aVar2);
  uVar95 = auVar46._0_4_;
  auVar57._4_4_ = uVar95;
  auVar57._0_4_ = uVar95;
  auVar57._8_4_ = uVar95;
  auVar57._12_4_ = uVar95;
  auVar37 = vshufps_avx(auVar46,auVar46,0x55);
  aVar3 = (pre->ray_space).vx.field_0;
  aVar4 = (pre->ray_space).vy.field_0;
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  fVar202 = (pre->ray_space).vz.field_0.m128[0];
  fVar94 = (pre->ray_space).vz.field_0.m128[1];
  fVar197 = (pre->ray_space).vz.field_0.m128[2];
  fVar198 = (pre->ray_space).vz.field_0.m128[3];
  auVar45._0_4_ = fVar202 * auVar46._0_4_;
  auVar45._4_4_ = fVar94 * auVar46._4_4_;
  auVar45._8_4_ = fVar197 * auVar46._8_4_;
  auVar45._12_4_ = fVar198 * auVar46._12_4_;
  auVar37 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar4,auVar37);
  auVar42 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar57);
  auVar46 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar2);
  uVar95 = auVar46._0_4_;
  auVar50._4_4_ = uVar95;
  auVar50._0_4_ = uVar95;
  auVar50._8_4_ = uVar95;
  auVar50._12_4_ = uVar95;
  auVar37 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar49._0_4_ = fVar202 * auVar46._0_4_;
  auVar49._4_4_ = fVar94 * auVar46._4_4_;
  auVar49._8_4_ = fVar197 * auVar46._8_4_;
  auVar49._12_4_ = fVar198 * auVar46._12_4_;
  auVar37 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar4,auVar37);
  auVar38 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar50);
  auVar46 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar2);
  uVar95 = auVar46._0_4_;
  auVar138._4_4_ = uVar95;
  auVar138._0_4_ = uVar95;
  auVar138._8_4_ = uVar95;
  auVar138._12_4_ = uVar95;
  auVar37 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar54._0_4_ = fVar202 * auVar46._0_4_;
  auVar54._4_4_ = fVar94 * auVar46._4_4_;
  auVar54._8_4_ = fVar197 * auVar46._8_4_;
  auVar54._12_4_ = fVar198 * auVar46._12_4_;
  auVar37 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar4,auVar37);
  auVar39 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar138);
  auVar46 = vsubps_avx(local_1c8,(undefined1  [16])aVar2);
  uVar95 = auVar46._0_4_;
  auVar156._4_4_ = uVar95;
  auVar156._0_4_ = uVar95;
  auVar156._8_4_ = uVar95;
  auVar156._12_4_ = uVar95;
  auVar37 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar139._0_4_ = fVar202 * auVar46._0_4_;
  auVar139._4_4_ = fVar94 * auVar46._4_4_;
  auVar139._8_4_ = fVar197 * auVar46._8_4_;
  auVar139._12_4_ = fVar198 * auVar46._12_4_;
  auVar37 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar4,auVar37);
  auVar40 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar156);
  auVar46 = vsubps_avx(_local_1b8,(undefined1  [16])aVar2);
  uVar95 = auVar46._0_4_;
  auVar165._4_4_ = uVar95;
  auVar165._0_4_ = uVar95;
  auVar165._8_4_ = uVar95;
  auVar165._12_4_ = uVar95;
  auVar37 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar157._0_4_ = auVar46._0_4_ * fVar202;
  auVar157._4_4_ = auVar46._4_4_ * fVar94;
  auVar157._8_4_ = auVar46._8_4_ * fVar197;
  auVar157._12_4_ = auVar46._12_4_ * fVar198;
  auVar37 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar4,auVar37);
  auVar41 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar165);
  auVar46 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar2);
  uVar95 = auVar46._0_4_;
  auVar177._4_4_ = uVar95;
  auVar177._0_4_ = uVar95;
  auVar177._8_4_ = uVar95;
  auVar177._12_4_ = uVar95;
  auVar37 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar166._0_4_ = auVar46._0_4_ * fVar202;
  auVar166._4_4_ = auVar46._4_4_ * fVar94;
  auVar166._8_4_ = auVar46._8_4_ * fVar197;
  auVar166._12_4_ = auVar46._12_4_ * fVar198;
  auVar37 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar4,auVar37);
  auVar75._16_16_ = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar177);
  auVar46 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar2);
  uVar95 = auVar46._0_4_;
  auVar187._4_4_ = uVar95;
  auVar187._0_4_ = uVar95;
  auVar187._8_4_ = uVar95;
  auVar187._12_4_ = uVar95;
  auVar37 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar178._0_4_ = auVar46._0_4_ * fVar202;
  auVar178._4_4_ = auVar46._4_4_ * fVar94;
  auVar178._8_4_ = auVar46._8_4_ * fVar197;
  auVar178._12_4_ = auVar46._12_4_ * fVar198;
  auVar37 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar4,auVar37);
  auVar43 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar187);
  auVar46 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar2);
  uVar95 = auVar46._0_4_;
  auVar188._4_4_ = uVar95;
  auVar188._0_4_ = uVar95;
  auVar188._8_4_ = uVar95;
  auVar188._12_4_ = uVar95;
  auVar37 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar56._0_4_ = fVar202 * auVar46._0_4_;
  auVar56._4_4_ = fVar94 * auVar46._4_4_;
  auVar56._8_4_ = fVar197 * auVar46._8_4_;
  auVar56._12_4_ = fVar198 * auVar46._12_4_;
  auVar37 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar37);
  auVar44 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar188);
  local_318 = vmovlhps_avx512f(auVar42,auVar41);
  auVar235 = ZEXT1664(local_318);
  local_278 = vmovlhps_avx(auVar38,auVar75._16_16_);
  local_288 = vmovlhps_avx512f(auVar39,auVar43);
  _local_108 = vmovlhps_avx512f(auVar40,auVar44);
  auVar37 = vminps_avx512vl(local_318,local_278);
  auVar47 = vmaxps_avx512vl(local_318,local_278);
  auVar46 = vminps_avx512vl(local_288,_local_108);
  auVar46 = vminps_avx(auVar37,auVar46);
  auVar37 = vmaxps_avx512vl(local_288,_local_108);
  auVar37 = vmaxps_avx(auVar47,auVar37);
  auVar47 = vshufpd_avx(auVar46,auVar46,3);
  auVar48 = vshufpd_avx(auVar37,auVar37,3);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar37 = vmaxps_avx(auVar37,auVar48);
  auVar46 = vandps_avx512vl(auVar46,auVar229._0_16_);
  auVar37 = vandps_avx512vl(auVar37,auVar229._0_16_);
  auVar37 = vmaxps_avx(auVar46,auVar37);
  auVar46 = vmovshdup_avx(auVar37);
  auVar37 = vmaxss_avx(auVar46,auVar37);
  local_328 = uVar31 + 0xff;
  local_298._8_8_ = auVar42._0_8_;
  local_298._0_8_ = auVar42._0_8_;
  local_2a8._8_8_ = auVar38._0_8_;
  local_2a8._0_8_ = auVar38._0_8_;
  local_2b8 = vmovddup_avx512vl(auVar39);
  local_2c8 = vmovddup_avx512vl(auVar40);
  register0x00001348 = auVar41._0_8_;
  local_2d8 = auVar41._0_8_;
  register0x00001388 = auVar75._16_8_;
  local_2e8 = auVar75._16_8_;
  register0x00001408 = auVar43._0_8_;
  local_2f8 = auVar43._0_8_;
  register0x00001448 = auVar44._0_8_;
  local_308 = auVar44._0_8_;
  local_118 = ZEXT416((uint)(auVar37._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_118);
  auVar37 = vxorps_avx512vl(local_b8._0_16_,auVar230._0_16_);
  local_d8 = vbroadcastss_avx512vl(auVar37);
  local_338 = vsubps_avx512vl(local_278,local_318);
  local_e8 = vsubps_avx512vl(local_288,local_278);
  local_f8 = vsubps_avx512vl(_local_108,local_288);
  local_128 = vsubps_avx(_local_1b8,local_1a8);
  local_138 = vsubps_avx512vl(_local_208,local_1e8);
  local_148 = vsubps_avx512vl(_local_218,local_1f8);
  _local_158 = vsubps_avx512vl(_local_1d8,local_1c8);
  bVar32 = false;
  auVar37 = ZEXT816(0x3f80000000000000);
  uVar26 = 0;
  local_320 = prim;
  auVar43 = auVar37;
LAB_01a2a524:
  auVar237 = ZEXT3264(local_b8);
  auVar46 = vshufps_avx(auVar43,auVar43,0x50);
  auVar218._8_4_ = 0x3f800000;
  auVar218._0_8_ = 0x3f8000003f800000;
  auVar218._12_4_ = 0x3f800000;
  auVar221._16_4_ = 0x3f800000;
  auVar221._0_16_ = auVar218;
  auVar221._20_4_ = 0x3f800000;
  auVar221._24_4_ = 0x3f800000;
  auVar221._28_4_ = 0x3f800000;
  auVar47 = vsubps_avx(auVar218,auVar46);
  fVar202 = auVar46._0_4_;
  auVar119._0_4_ = local_2d8._0_4_ * fVar202;
  fVar94 = auVar46._4_4_;
  auVar119._4_4_ = local_2d8._4_4_ * fVar94;
  fVar197 = auVar46._8_4_;
  auVar119._8_4_ = local_2d8._8_4_ * fVar197;
  fVar198 = auVar46._12_4_;
  auVar119._12_4_ = local_2d8._12_4_ * fVar198;
  auVar127._0_4_ = local_2e8._0_4_ * fVar202;
  auVar127._4_4_ = local_2e8._4_4_ * fVar94;
  auVar127._8_4_ = local_2e8._8_4_ * fVar197;
  auVar127._12_4_ = local_2e8._12_4_ * fVar198;
  auVar140._0_4_ = local_2f8._0_4_ * fVar202;
  auVar140._4_4_ = local_2f8._4_4_ * fVar94;
  auVar140._8_4_ = local_2f8._8_4_ * fVar197;
  auVar140._12_4_ = local_2f8._12_4_ * fVar198;
  auVar106._0_4_ = local_308._0_4_ * fVar202;
  auVar106._4_4_ = local_308._4_4_ * fVar94;
  auVar106._8_4_ = local_308._8_4_ * fVar197;
  auVar106._12_4_ = local_308._12_4_ * fVar198;
  auVar48 = vfmadd231ps_fma(auVar119,auVar47,local_298);
  auVar42 = vfmadd231ps_fma(auVar127,auVar47,local_2a8);
  auVar38 = vfmadd231ps_avx512vl(auVar140,auVar47,local_2b8);
  auVar47 = vfmadd231ps_avx512vl(auVar106,local_2c8,auVar47);
  auVar46 = vmovshdup_avx(auVar37);
  fVar94 = auVar37._0_4_;
  fVar202 = (auVar46._0_4_ - fVar94) * 0.04761905;
  auVar162._4_4_ = fVar94;
  auVar162._0_4_ = fVar94;
  auVar162._8_4_ = fVar94;
  auVar162._12_4_ = fVar94;
  auVar162._16_4_ = fVar94;
  auVar162._20_4_ = fVar94;
  auVar162._24_4_ = fVar94;
  auVar162._28_4_ = fVar94;
  auVar117._0_8_ = auVar46._0_8_;
  auVar117._8_8_ = auVar117._0_8_;
  auVar117._16_8_ = auVar117._0_8_;
  auVar117._24_8_ = auVar117._0_8_;
  auVar63 = vsubps_avx(auVar117,auVar162);
  uVar95 = auVar48._0_4_;
  auVar118._4_4_ = uVar95;
  auVar118._0_4_ = uVar95;
  auVar118._8_4_ = uVar95;
  auVar118._12_4_ = uVar95;
  auVar118._16_4_ = uVar95;
  auVar118._20_4_ = uVar95;
  auVar118._24_4_ = uVar95;
  auVar118._28_4_ = uVar95;
  auVar181._8_4_ = 1;
  auVar181._0_8_ = 0x100000001;
  auVar181._12_4_ = 1;
  auVar181._16_4_ = 1;
  auVar181._20_4_ = 1;
  auVar181._24_4_ = 1;
  auVar181._28_4_ = 1;
  auVar78 = ZEXT1632(auVar48);
  auVar61 = vpermps_avx2(auVar181,auVar78);
  auVar68 = vbroadcastss_avx512vl(auVar42);
  auVar79 = ZEXT1632(auVar42);
  auVar62 = vpermps_avx512vl(auVar181,auVar79);
  auVar69 = vbroadcastss_avx512vl(auVar38);
  auVar76 = ZEXT1632(auVar38);
  auVar70 = vpermps_avx512vl(auVar181,auVar76);
  auVar71 = vbroadcastss_avx512vl(auVar47);
  auVar75 = ZEXT1632(auVar47);
  auVar72 = vpermps_avx512vl(auVar181,auVar75);
  auVar182._4_4_ = fVar202;
  auVar182._0_4_ = fVar202;
  auVar182._8_4_ = fVar202;
  auVar182._12_4_ = fVar202;
  auVar182._16_4_ = fVar202;
  auVar182._20_4_ = fVar202;
  auVar182._24_4_ = fVar202;
  auVar182._28_4_ = fVar202;
  auVar73 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar60 = vpermps_avx512vl(auVar73,auVar78);
  auVar153._8_4_ = 3;
  auVar153._0_8_ = 0x300000003;
  auVar153._12_4_ = 3;
  auVar153._16_4_ = 3;
  auVar153._20_4_ = 3;
  auVar153._24_4_ = 3;
  auVar153._28_4_ = 3;
  auVar58 = vpermps_avx512vl(auVar153,auVar78);
  auVar59 = vpermps_avx512vl(auVar73,auVar79);
  auVar78 = vpermps_avx2(auVar153,auVar79);
  auVar74 = vpermps_avx512vl(auVar73,auVar76);
  auVar79 = vpermps_avx2(auVar153,auVar76);
  auVar73 = vpermps_avx512vl(auVar73,auVar75);
  auVar75 = vpermps_avx512vl(auVar153,auVar75);
  auVar46 = vfmadd132ps_fma(auVar63,auVar162,_DAT_01f7b040);
  auVar63 = vsubps_avx(auVar221,ZEXT1632(auVar46));
  auVar76 = vmulps_avx512vl(auVar68,ZEXT1632(auVar46));
  auVar80 = ZEXT1632(auVar46);
  auVar77 = vmulps_avx512vl(auVar62,auVar80);
  auVar47 = vfmadd231ps_fma(auVar76,auVar63,auVar118);
  auVar48 = vfmadd231ps_fma(auVar77,auVar63,auVar61);
  auVar76 = vmulps_avx512vl(auVar69,auVar80);
  auVar77 = vmulps_avx512vl(auVar70,auVar80);
  auVar68 = vfmadd231ps_avx512vl(auVar76,auVar63,auVar68);
  auVar62 = vfmadd231ps_avx512vl(auVar77,auVar63,auVar62);
  auVar76 = vmulps_avx512vl(auVar71,auVar80);
  auVar77 = ZEXT1632(auVar46);
  auVar72 = vmulps_avx512vl(auVar72,auVar77);
  auVar69 = vfmadd231ps_avx512vl(auVar76,auVar63,auVar69);
  auVar70 = vfmadd231ps_avx512vl(auVar72,auVar63,auVar70);
  fVar197 = auVar46._0_4_;
  fVar198 = auVar46._4_4_;
  auVar17._4_4_ = fVar198 * auVar68._4_4_;
  auVar17._0_4_ = fVar197 * auVar68._0_4_;
  fVar199 = auVar46._8_4_;
  auVar17._8_4_ = fVar199 * auVar68._8_4_;
  fVar200 = auVar46._12_4_;
  auVar17._12_4_ = fVar200 * auVar68._12_4_;
  auVar17._16_4_ = auVar68._16_4_ * 0.0;
  auVar17._20_4_ = auVar68._20_4_ * 0.0;
  auVar17._24_4_ = auVar68._24_4_ * 0.0;
  auVar17._28_4_ = fVar94;
  auVar18._4_4_ = fVar198 * auVar62._4_4_;
  auVar18._0_4_ = fVar197 * auVar62._0_4_;
  auVar18._8_4_ = fVar199 * auVar62._8_4_;
  auVar18._12_4_ = fVar200 * auVar62._12_4_;
  auVar18._16_4_ = auVar62._16_4_ * 0.0;
  auVar18._20_4_ = auVar62._20_4_ * 0.0;
  auVar18._24_4_ = auVar62._24_4_ * 0.0;
  auVar18._28_4_ = auVar61._28_4_;
  auVar47 = vfmadd231ps_fma(auVar17,auVar63,ZEXT1632(auVar47));
  auVar48 = vfmadd231ps_fma(auVar18,auVar63,ZEXT1632(auVar48));
  auVar111._0_4_ = fVar197 * auVar69._0_4_;
  auVar111._4_4_ = fVar198 * auVar69._4_4_;
  auVar111._8_4_ = fVar199 * auVar69._8_4_;
  auVar111._12_4_ = fVar200 * auVar69._12_4_;
  auVar111._16_4_ = auVar69._16_4_ * 0.0;
  auVar111._20_4_ = auVar69._20_4_ * 0.0;
  auVar111._24_4_ = auVar69._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar19._4_4_ = fVar198 * auVar70._4_4_;
  auVar19._0_4_ = fVar197 * auVar70._0_4_;
  auVar19._8_4_ = fVar199 * auVar70._8_4_;
  auVar19._12_4_ = fVar200 * auVar70._12_4_;
  auVar19._16_4_ = auVar70._16_4_ * 0.0;
  auVar19._20_4_ = auVar70._20_4_ * 0.0;
  auVar19._24_4_ = auVar70._24_4_ * 0.0;
  auVar19._28_4_ = auVar69._28_4_;
  auVar42 = vfmadd231ps_fma(auVar111,auVar63,auVar68);
  auVar38 = vfmadd231ps_fma(auVar19,auVar63,auVar62);
  auVar20._28_4_ = auVar62._28_4_;
  auVar20._0_28_ =
       ZEXT1628(CONCAT412(fVar200 * auVar38._12_4_,
                          CONCAT48(fVar199 * auVar38._8_4_,
                                   CONCAT44(fVar198 * auVar38._4_4_,fVar197 * auVar38._0_4_))));
  auVar39 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar42._12_4_,
                                               CONCAT48(fVar199 * auVar42._8_4_,
                                                        CONCAT44(fVar198 * auVar42._4_4_,
                                                                 fVar197 * auVar42._0_4_)))),auVar63
                            ,ZEXT1632(auVar47));
  auVar40 = vfmadd231ps_fma(auVar20,auVar63,ZEXT1632(auVar48));
  auVar61 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar47));
  auVar68 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar48));
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar61 = vmulps_avx512vl(auVar61,auVar62);
  auVar68 = vmulps_avx512vl(auVar68,auVar62);
  auVar175._0_4_ = fVar202 * auVar61._0_4_;
  auVar175._4_4_ = fVar202 * auVar61._4_4_;
  auVar175._8_4_ = fVar202 * auVar61._8_4_;
  auVar175._12_4_ = fVar202 * auVar61._12_4_;
  auVar175._16_4_ = fVar202 * auVar61._16_4_;
  auVar175._20_4_ = fVar202 * auVar61._20_4_;
  auVar175._24_4_ = fVar202 * auVar61._24_4_;
  auVar175._28_4_ = 0;
  auVar61 = vmulps_avx512vl(auVar182,auVar68);
  auVar48 = vxorps_avx512vl(auVar71._0_16_,auVar71._0_16_);
  auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar39),_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar69 = vpermt2ps_avx512vl(ZEXT1632(auVar40),_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar112._0_4_ = auVar175._0_4_ + auVar39._0_4_;
  auVar112._4_4_ = auVar175._4_4_ + auVar39._4_4_;
  auVar112._8_4_ = auVar175._8_4_ + auVar39._8_4_;
  auVar112._12_4_ = auVar175._12_4_ + auVar39._12_4_;
  auVar112._16_4_ = auVar175._16_4_ + 0.0;
  auVar112._20_4_ = auVar175._20_4_ + 0.0;
  auVar112._24_4_ = auVar175._24_4_ + 0.0;
  auVar112._28_4_ = 0;
  auVar80 = ZEXT1632(auVar48);
  auVar70 = vpermt2ps_avx512vl(auVar175,_DAT_01fb9fc0,auVar80);
  auVar71 = vaddps_avx512vl(ZEXT1632(auVar40),auVar61);
  auVar72 = vpermt2ps_avx512vl(auVar61,_DAT_01fb9fc0,auVar80);
  auVar61 = vsubps_avx(auVar68,auVar70);
  auVar70 = vsubps_avx512vl(auVar69,auVar72);
  auVar72 = vmulps_avx512vl(auVar59,auVar77);
  auVar76 = vmulps_avx512vl(auVar78,auVar77);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar63,auVar60);
  auVar60 = vfmadd231ps_avx512vl(auVar76,auVar63,auVar58);
  auVar58 = vmulps_avx512vl(auVar74,auVar77);
  auVar76 = vmulps_avx512vl(auVar79,auVar77);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar63,auVar59);
  auVar78 = vfmadd231ps_avx512vl(auVar76,auVar63,auVar78);
  auVar73 = vmulps_avx512vl(auVar73,auVar77);
  auVar59 = vmulps_avx512vl(auVar75,auVar77);
  auVar47 = vfmadd231ps_fma(auVar73,auVar63,auVar74);
  auVar73 = vfmadd231ps_avx512vl(auVar59,auVar63,auVar79);
  auVar59 = vmulps_avx512vl(auVar77,auVar58);
  auVar75 = ZEXT1632(auVar46);
  auVar74 = vmulps_avx512vl(auVar75,auVar78);
  auVar72 = vfmadd231ps_avx512vl(auVar59,auVar63,auVar72);
  auVar60 = vfmadd231ps_avx512vl(auVar74,auVar63,auVar60);
  auVar73 = vmulps_avx512vl(auVar75,auVar73);
  auVar58 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar200 * auVar47._12_4_,
                                          CONCAT48(fVar199 * auVar47._8_4_,
                                                   CONCAT44(fVar198 * auVar47._4_4_,
                                                            fVar197 * auVar47._0_4_)))),auVar63,
                       auVar58);
  auVar78 = vfmadd231ps_avx512vl(auVar73,auVar63,auVar78);
  auVar21._4_4_ = fVar198 * auVar58._4_4_;
  auVar21._0_4_ = fVar197 * auVar58._0_4_;
  auVar21._8_4_ = fVar199 * auVar58._8_4_;
  auVar21._12_4_ = fVar200 * auVar58._12_4_;
  auVar21._16_4_ = auVar58._16_4_ * 0.0;
  auVar21._20_4_ = auVar58._20_4_ * 0.0;
  auVar21._24_4_ = auVar58._24_4_ * 0.0;
  auVar21._28_4_ = auVar79._28_4_;
  auVar79 = vmulps_avx512vl(auVar75,auVar78);
  auVar73 = vfmadd231ps_avx512vl(auVar21,auVar63,auVar72);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar60,auVar63);
  auVar63 = vsubps_avx512vl(auVar58,auVar72);
  auVar78 = vsubps_avx512vl(auVar78,auVar60);
  auVar63 = vmulps_avx512vl(auVar63,auVar62);
  auVar78 = vmulps_avx512vl(auVar78,auVar62);
  fVar94 = fVar202 * auVar63._0_4_;
  fVar197 = fVar202 * auVar63._4_4_;
  auVar22._4_4_ = fVar197;
  auVar22._0_4_ = fVar94;
  fVar198 = fVar202 * auVar63._8_4_;
  auVar22._8_4_ = fVar198;
  fVar199 = fVar202 * auVar63._12_4_;
  auVar22._12_4_ = fVar199;
  fVar200 = fVar202 * auVar63._16_4_;
  auVar22._16_4_ = fVar200;
  fVar201 = fVar202 * auVar63._20_4_;
  auVar22._20_4_ = fVar201;
  fVar202 = fVar202 * auVar63._24_4_;
  auVar22._24_4_ = fVar202;
  auVar22._28_4_ = auVar63._28_4_;
  auVar78 = vmulps_avx512vl(auVar182,auVar78);
  auVar62 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9fc0,auVar80);
  auVar72 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,auVar80);
  auVar183._0_4_ = auVar73._0_4_ + fVar94;
  auVar183._4_4_ = auVar73._4_4_ + fVar197;
  auVar183._8_4_ = auVar73._8_4_ + fVar198;
  auVar183._12_4_ = auVar73._12_4_ + fVar199;
  auVar183._16_4_ = auVar73._16_4_ + fVar200;
  auVar183._20_4_ = auVar73._20_4_ + fVar201;
  auVar183._24_4_ = auVar73._24_4_ + fVar202;
  auVar183._28_4_ = auVar73._28_4_ + auVar63._28_4_;
  auVar63 = vpermt2ps_avx512vl(auVar22,_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar60 = vaddps_avx512vl(auVar79,auVar78);
  auVar78 = vpermt2ps_avx512vl(auVar78,_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar63 = vsubps_avx(auVar62,auVar63);
  auVar78 = vsubps_avx512vl(auVar72,auVar78);
  in_ZMM17 = ZEXT3264(auVar78);
  auVar122 = ZEXT1632(auVar39);
  auVar58 = vsubps_avx512vl(auVar73,auVar122);
  auVar133 = ZEXT1632(auVar40);
  auVar59 = vsubps_avx512vl(auVar79,auVar133);
  auVar74 = vsubps_avx512vl(auVar62,auVar68);
  auVar58 = vaddps_avx512vl(auVar58,auVar74);
  auVar74 = vsubps_avx512vl(auVar72,auVar69);
  auVar59 = vaddps_avx512vl(auVar59,auVar74);
  auVar74 = vmulps_avx512vl(auVar133,auVar58);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar122,auVar59);
  auVar75 = vmulps_avx512vl(auVar71,auVar58);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar112,auVar59);
  auVar76 = vmulps_avx512vl(auVar70,auVar58);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar61,auVar59);
  auVar77 = vmulps_avx512vl(auVar69,auVar58);
  auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar68,auVar59);
  auVar80 = vmulps_avx512vl(auVar79,auVar58);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar73,auVar59);
  auVar81 = vmulps_avx512vl(auVar60,auVar58);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar183,auVar59);
  auVar82 = vmulps_avx512vl(auVar78,auVar58);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar63,auVar59);
  auVar58 = vmulps_avx512vl(auVar72,auVar58);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar62,auVar59);
  auVar59 = vminps_avx512vl(auVar74,auVar75);
  auVar74 = vmaxps_avx512vl(auVar74,auVar75);
  auVar75 = vminps_avx512vl(auVar76,auVar77);
  auVar59 = vminps_avx512vl(auVar59,auVar75);
  auVar75 = vmaxps_avx512vl(auVar76,auVar77);
  auVar74 = vmaxps_avx512vl(auVar74,auVar75);
  auVar75 = vminps_avx512vl(auVar80,auVar81);
  auVar76 = vmaxps_avx512vl(auVar80,auVar81);
  auVar77 = vminps_avx512vl(auVar82,auVar58);
  auVar75 = vminps_avx512vl(auVar75,auVar77);
  auVar59 = vminps_avx512vl(auVar59,auVar75);
  auVar58 = vmaxps_avx512vl(auVar82,auVar58);
  auVar58 = vmaxps_avx512vl(auVar76,auVar58);
  auVar58 = vmaxps_avx512vl(auVar74,auVar58);
  uVar11 = vcmpps_avx512vl(auVar59,local_b8,2);
  uVar12 = vcmpps_avx512vl(auVar58,local_d8,5);
  bVar24 = (byte)uVar11 & (byte)uVar12 & 0x7f;
  if (bVar24 != 0) {
    auVar58 = vsubps_avx512vl(auVar68,auVar122);
    auVar59 = vsubps_avx512vl(auVar69,auVar133);
    auVar74 = vsubps_avx512vl(auVar62,auVar73);
    auVar58 = vaddps_avx512vl(auVar58,auVar74);
    auVar74 = vsubps_avx512vl(auVar72,auVar79);
    auVar59 = vaddps_avx512vl(auVar59,auVar74);
    auVar74 = vmulps_avx512vl(auVar133,auVar58);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar59,auVar122);
    auVar71 = vmulps_avx512vl(auVar71,auVar58);
    auVar71 = vfnmadd213ps_avx512vl(auVar112,auVar59,auVar71);
    auVar70 = vmulps_avx512vl(auVar70,auVar58);
    auVar70 = vfnmadd213ps_avx512vl(auVar61,auVar59,auVar70);
    auVar61 = vmulps_avx512vl(auVar69,auVar58);
    auVar69 = vfnmadd231ps_avx512vl(auVar61,auVar59,auVar68);
    auVar61 = vmulps_avx512vl(auVar79,auVar58);
    auVar79 = vfnmadd231ps_avx512vl(auVar61,auVar59,auVar73);
    auVar61 = vmulps_avx512vl(auVar60,auVar58);
    auVar73 = vfnmadd213ps_avx512vl(auVar183,auVar59,auVar61);
    auVar61 = vmulps_avx512vl(auVar78,auVar58);
    auVar60 = vfnmadd213ps_avx512vl(auVar63,auVar59,auVar61);
    auVar63 = vmulps_avx512vl(auVar72,auVar58);
    auVar62 = vfnmadd231ps_avx512vl(auVar63,auVar62,auVar59);
    auVar61 = vminps_avx(auVar74,auVar71);
    auVar63 = vmaxps_avx(auVar74,auVar71);
    auVar68 = vminps_avx(auVar70,auVar69);
    auVar68 = vminps_avx(auVar61,auVar68);
    auVar61 = vmaxps_avx(auVar70,auVar69);
    auVar63 = vmaxps_avx(auVar63,auVar61);
    auVar78 = vminps_avx(auVar79,auVar73);
    auVar61 = vmaxps_avx(auVar79,auVar73);
    auVar79 = vminps_avx(auVar60,auVar62);
    auVar78 = vminps_avx(auVar78,auVar79);
    auVar78 = vminps_avx(auVar68,auVar78);
    auVar68 = vmaxps_avx(auVar60,auVar62);
    auVar61 = vmaxps_avx(auVar61,auVar68);
    auVar63 = vmaxps_avx(auVar63,auVar61);
    uVar11 = vcmpps_avx512vl(auVar63,local_d8,5);
    uVar12 = vcmpps_avx512vl(auVar78,local_b8,2);
    bVar24 = bVar24 & (byte)uVar11 & (byte)uVar12;
    if (bVar24 != 0) {
      auStack_198[uVar26] = (uint)bVar24;
      uVar11 = vmovlps_avx(auVar37);
      (&uStack_98)[uVar26] = uVar11;
      uVar1 = vmovlps_avx(auVar43);
      auStack_58[uVar26] = uVar1;
      uVar26 = (ulong)((int)uVar26 + 1);
    }
  }
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar228 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar229 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar230 = ZEXT1664(auVar37);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar231 = ZEXT3264(auVar63);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar232 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar233 = ZEXT1664(auVar37);
  auVar234 = ZEXT3264(_DAT_01fb9fe0);
  auVar75._16_16_ = DAT_01fb9fe0._16_16_;
  auVar236 = ZEXT1664(local_338);
LAB_01a2aa21:
  do {
    do {
      do {
        local_248.valid = &local_340;
        auVar46 = auVar228._0_16_;
        if ((int)uVar26 == 0) {
          if (bVar32) goto LAB_01a2b8e3;
          fVar202 = ray->tfar;
          auVar16._4_4_ = fVar202;
          auVar16._0_4_ = fVar202;
          auVar16._8_4_ = fVar202;
          auVar16._12_4_ = fVar202;
          auVar16._16_4_ = fVar202;
          auVar16._20_4_ = fVar202;
          auVar16._24_4_ = fVar202;
          auVar16._28_4_ = fVar202;
          uVar11 = vcmpps_avx512vl(local_78,auVar16,2);
          uVar31 = (ulong)((uint)uVar31 & (uint)local_328 & (uint)uVar11);
          prim = local_320;
          goto LAB_01a29eae;
        }
        uVar25 = (int)uVar26 - 1;
        uVar27 = (ulong)uVar25;
        uVar6 = auStack_198[uVar27];
        auVar43._8_8_ = 0;
        auVar43._0_8_ = auStack_58[uVar27];
        uVar1 = 0;
        for (uVar30 = (ulong)uVar6; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          uVar1 = uVar1 + 1;
        }
        uVar29 = uVar6 - 1 & uVar6;
        bVar35 = uVar29 == 0;
        auStack_198[uVar27] = uVar29;
        if (bVar35) {
          uVar26 = (ulong)uVar25;
        }
        auVar96._8_8_ = 0;
        auVar96._0_8_ = uVar1;
        auVar37 = vpunpcklqdq_avx(auVar96,ZEXT416((int)uVar1 + 1));
        auVar37 = vcvtqq2ps_avx512vl(auVar37);
        auVar37 = vmulps_avx512vl(auVar37,auVar232._0_16_);
        uVar95 = *(undefined4 *)((long)&uStack_98 + uVar27 * 8 + 4);
        auVar13._4_4_ = uVar95;
        auVar13._0_4_ = uVar95;
        auVar13._8_4_ = uVar95;
        auVar13._12_4_ = uVar95;
        auVar47 = vmulps_avx512vl(auVar37,auVar13);
        auVar48 = auVar233._0_16_;
        auVar37 = vsubps_avx512vl(auVar48,auVar37);
        uVar95 = *(undefined4 *)(&uStack_98 + uVar27);
        auVar14._4_4_ = uVar95;
        auVar14._0_4_ = uVar95;
        auVar14._8_4_ = uVar95;
        auVar14._12_4_ = uVar95;
        auVar37 = vfmadd231ps_avx512vl(auVar47,auVar37,auVar14);
        auVar47 = vmovshdup_avx(auVar37);
        fVar202 = auVar47._0_4_ - auVar37._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar202));
        if (uVar6 == 0 || bVar35) goto LAB_01a2a524;
        auVar47 = vshufps_avx(auVar43,auVar43,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar202));
        auVar39 = vsubps_avx512vl(auVar48,auVar47);
        fVar94 = auVar47._0_4_;
        auVar128._0_4_ = fVar94 * (float)local_2d8._0_4_;
        fVar197 = auVar47._4_4_;
        auVar128._4_4_ = fVar197 * (float)local_2d8._4_4_;
        fVar198 = auVar47._8_4_;
        auVar128._8_4_ = fVar198 * fStack_2d0;
        fVar199 = auVar47._12_4_;
        auVar128._12_4_ = fVar199 * fStack_2cc;
        auVar141._0_4_ = fVar94 * (float)local_2e8._0_4_;
        auVar141._4_4_ = fVar197 * (float)local_2e8._4_4_;
        auVar141._8_4_ = fVar198 * fStack_2e0;
        auVar141._12_4_ = fVar199 * fStack_2dc;
        auVar147._0_4_ = fVar94 * (float)local_2f8._0_4_;
        auVar147._4_4_ = fVar197 * (float)local_2f8._4_4_;
        auVar147._8_4_ = fVar198 * fStack_2f0;
        auVar147._12_4_ = fVar199 * fStack_2ec;
        auVar113._0_4_ = fVar94 * (float)local_308._0_4_;
        auVar113._4_4_ = fVar197 * (float)local_308._4_4_;
        auVar113._8_4_ = fVar198 * fStack_300;
        auVar113._12_4_ = fVar199 * fStack_2fc;
        auVar47 = vfmadd231ps_fma(auVar128,auVar39,local_298);
        auVar42 = vfmadd231ps_fma(auVar141,auVar39,local_2a8);
        auVar38 = vfmadd231ps_fma(auVar147,auVar39,local_2b8);
        auVar39 = vfmadd231ps_fma(auVar113,auVar39,local_2c8);
        auVar123._16_16_ = auVar47;
        auVar123._0_16_ = auVar47;
        auVar134._16_16_ = auVar42;
        auVar134._0_16_ = auVar42;
        auVar145._16_16_ = auVar38;
        auVar145._0_16_ = auVar38;
        auVar61 = vpermps_avx512vl(auVar234._0_32_,ZEXT1632(auVar37));
        auVar63 = vsubps_avx(auVar134,auVar123);
        auVar42 = vfmadd213ps_fma(auVar63,auVar61,auVar123);
        auVar63 = vsubps_avx(auVar145,auVar134);
        auVar40 = vfmadd213ps_fma(auVar63,auVar61,auVar134);
        auVar47 = vsubps_avx(auVar39,auVar38);
        auVar135._16_16_ = auVar47;
        auVar135._0_16_ = auVar47;
        auVar47 = vfmadd213ps_fma(auVar135,auVar61,auVar145);
        auVar63 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar42));
        auVar42 = vfmadd213ps_fma(auVar63,auVar61,ZEXT1632(auVar42));
        auVar63 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar40));
        auVar47 = vfmadd213ps_fma(auVar63,auVar61,ZEXT1632(auVar40));
        auVar63 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar42));
        auVar57 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar63,auVar61);
        auVar63 = vmulps_avx512vl(auVar63,auVar231._0_32_);
        auVar75._16_16_ = auVar63._16_16_;
        fVar94 = fVar202 * 0.33333334;
        auVar148._0_8_ =
             CONCAT44(auVar57._4_4_ + fVar94 * auVar63._4_4_,auVar57._0_4_ + fVar94 * auVar63._0_4_)
        ;
        auVar148._8_4_ = auVar57._8_4_ + fVar94 * auVar63._8_4_;
        auVar148._12_4_ = auVar57._12_4_ + fVar94 * auVar63._12_4_;
        auVar129._0_4_ = fVar94 * auVar63._16_4_;
        auVar129._4_4_ = fVar94 * auVar63._20_4_;
        auVar129._8_4_ = fVar94 * auVar63._24_4_;
        auVar129._12_4_ = fVar94 * auVar63._28_4_;
        auVar53 = vsubps_avx((undefined1  [16])0x0,auVar129);
        auVar40 = vshufpd_avx(auVar57,auVar57,3);
        auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar47 = vsubps_avx(auVar40,auVar57);
        auVar42 = vsubps_avx(auVar41,(undefined1  [16])0x0);
        auVar167._0_4_ = auVar47._0_4_ + auVar42._0_4_;
        auVar167._4_4_ = auVar47._4_4_ + auVar42._4_4_;
        auVar167._8_4_ = auVar47._8_4_ + auVar42._8_4_;
        auVar167._12_4_ = auVar47._12_4_ + auVar42._12_4_;
        auVar47 = vshufps_avx(auVar57,auVar57,0xb1);
        auVar42 = vshufps_avx(auVar148,auVar148,0xb1);
        auVar38 = vshufps_avx(auVar53,auVar53,0xb1);
        auVar39 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar219._4_4_ = auVar167._0_4_;
        auVar219._0_4_ = auVar167._0_4_;
        auVar219._8_4_ = auVar167._0_4_;
        auVar219._12_4_ = auVar167._0_4_;
        auVar44 = vshufps_avx(auVar167,auVar167,0x55);
        fVar94 = auVar44._0_4_;
        auVar179._0_4_ = auVar47._0_4_ * fVar94;
        fVar197 = auVar44._4_4_;
        auVar179._4_4_ = auVar47._4_4_ * fVar197;
        fVar198 = auVar44._8_4_;
        auVar179._8_4_ = auVar47._8_4_ * fVar198;
        fVar199 = auVar44._12_4_;
        auVar179._12_4_ = auVar47._12_4_ * fVar199;
        auVar189._0_4_ = auVar42._0_4_ * fVar94;
        auVar189._4_4_ = auVar42._4_4_ * fVar197;
        auVar189._8_4_ = auVar42._8_4_ * fVar198;
        auVar189._12_4_ = auVar42._12_4_ * fVar199;
        auVar205._0_4_ = auVar38._0_4_ * fVar94;
        auVar205._4_4_ = auVar38._4_4_ * fVar197;
        auVar205._8_4_ = auVar38._8_4_ * fVar198;
        auVar205._12_4_ = auVar38._12_4_ * fVar199;
        auVar168._0_4_ = auVar39._0_4_ * fVar94;
        auVar168._4_4_ = auVar39._4_4_ * fVar197;
        auVar168._8_4_ = auVar39._8_4_ * fVar198;
        auVar168._12_4_ = auVar39._12_4_ * fVar199;
        auVar47 = vfmadd231ps_fma(auVar179,auVar219,auVar57);
        auVar42 = vfmadd231ps_fma(auVar189,auVar219,auVar148);
        auVar51 = vfmadd231ps_fma(auVar205,auVar219,auVar53);
        auVar52 = vfmadd231ps_fma(auVar168,(undefined1  [16])0x0,auVar219);
        auVar44 = vshufpd_avx(auVar47,auVar47,1);
        auVar45 = vshufpd_avx(auVar42,auVar42,1);
        auVar49 = vshufpd_avx512vl(auVar51,auVar51,1);
        auVar50 = vshufpd_avx512vl(auVar52,auVar52,1);
        in_ZMM17 = ZEXT1664(auVar50);
        auVar38 = vminss_avx(auVar47,auVar42);
        auVar47 = vmaxss_avx(auVar42,auVar47);
        auVar39 = vminss_avx(auVar51,auVar52);
        auVar42 = vmaxss_avx(auVar52,auVar51);
        auVar38 = vminss_avx(auVar38,auVar39);
        auVar47 = vmaxss_avx(auVar42,auVar47);
        auVar39 = vminss_avx(auVar44,auVar45);
        auVar42 = vmaxss_avx(auVar45,auVar44);
        auVar44 = vminss_avx512f(auVar49,auVar50);
        auVar45 = vmaxss_avx512f(auVar50,auVar49);
        auVar42 = vmaxss_avx(auVar45,auVar42);
        auVar39 = vminss_avx512f(auVar39,auVar44);
        fVar197 = auVar42._0_4_;
        fVar94 = auVar47._0_4_;
        if (auVar38._0_4_ < 0.0001) {
          bVar36 = fVar197 == -0.0001;
          bVar33 = NAN(fVar197);
          if (fVar197 <= -0.0001) goto LAB_01a2ac4b;
          break;
        }
LAB_01a2ac4b:
        vucomiss_avx512f(auVar39);
        bVar36 = fVar197 <= -0.0001;
        bVar34 = -0.0001 < fVar94;
        bVar33 = bVar36;
        if (!bVar36) break;
        uVar11 = vcmpps_avx512vl(auVar38,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar12 = vcmpps_avx512vl(auVar39,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar24 = (byte)uVar11 & (byte)uVar12;
        bVar23 = (bVar24 & 1) == 0;
        bVar36 = bVar34 && bVar23;
        bVar33 = bVar34 && (bVar24 & 1) == 0;
      } while (!bVar34 || !bVar23);
      auVar51 = vxorps_avx512vl(auVar235._0_16_,auVar235._0_16_);
      vcmpss_avx512f(auVar38,auVar51,1);
      uVar11 = vcmpss_avx512f(auVar47,auVar51,1);
      bVar34 = (bool)((byte)uVar11 & 1);
      auVar75._0_16_ = auVar238._0_16_;
      auVar83._4_28_ = auVar75._4_28_;
      auVar83._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * auVar238._0_4_);
      vucomiss_avx512f(auVar83._0_16_);
      bVar33 = (bool)(!bVar36 | bVar33);
      bVar34 = bVar33 == false;
      auVar85._16_16_ = auVar75._16_16_;
      auVar85._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar84._4_28_ = auVar85._4_28_;
      auVar84._0_4_ = (uint)bVar33 * auVar51._0_4_ + (uint)!bVar33 * 0x7f800000;
      auVar45 = auVar84._0_16_;
      auVar87._16_16_ = auVar75._16_16_;
      auVar87._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar86._4_28_ = auVar87._4_28_;
      auVar86._0_4_ = (uint)bVar33 * auVar51._0_4_ + (uint)!bVar33 * -0x800000;
      auVar44 = auVar86._0_16_;
      auVar52 = vxorps_avx512vl(auVar237._0_16_,auVar237._0_16_);
      auVar237 = ZEXT1664(auVar52);
      uVar11 = vcmpss_avx512f(auVar39,auVar51,1);
      bVar36 = (bool)((byte)uVar11 & 1);
      auVar89._16_16_ = auVar75._16_16_;
      auVar89._0_16_ = auVar238._0_16_;
      auVar88._4_28_ = auVar89._4_28_;
      auVar88._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar238._0_4_);
      auVar39 = vucomiss_avx512f(auVar88._0_16_);
      in_ZMM17 = ZEXT1664(auVar39);
      if ((bVar33) || (bVar34)) {
        auVar39 = vucomiss_avx512f(auVar38);
        if ((bVar33) || (bVar34)) {
          auVar51 = vxorps_avx512vl(auVar38,auVar230._0_16_);
          in_ZMM17 = ZEXT1664(auVar51);
          auVar38 = vsubss_avx512f(auVar39,auVar38);
          auVar38 = vdivss_avx512f(auVar51,auVar38);
          auVar39 = vsubss_avx512f(ZEXT416(0x3f800000),auVar38);
          auVar39 = vfmadd213ss_avx512f(auVar39,auVar52,auVar38);
          auVar38 = auVar39;
        }
        else {
          auVar38 = vxorps_avx512vl(auVar39,auVar39);
          vucomiss_avx512f(auVar38);
          auVar39 = ZEXT416(0x3f800000);
          if ((bVar33) || (bVar34)) {
            auVar39 = SUB6416(ZEXT464(0xff800000),0);
            auVar38 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar45 = vminss_avx512f(auVar45,auVar38);
        auVar44 = vmaxss_avx(auVar39,auVar44);
      }
      auVar238 = ZEXT464(0x3f800000);
      auVar235 = ZEXT1664(local_318);
      uVar11 = vcmpss_avx512f(auVar42,auVar52,1);
      bVar36 = (bool)((byte)uVar11 & 1);
      auVar42 = auVar238._0_16_;
      fVar198 = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * 0x3f800000);
      if ((auVar83._0_4_ != fVar198) || (NAN(auVar83._0_4_) || NAN(fVar198))) {
        if ((fVar197 != fVar94) || (NAN(fVar197) || NAN(fVar94))) {
          auVar47 = vxorps_avx512vl(auVar47,auVar230._0_16_);
          auVar169._0_4_ = auVar47._0_4_ / (fVar197 - fVar94);
          auVar169._4_12_ = auVar47._4_12_;
          auVar47 = vsubss_avx512f(auVar42,auVar169);
          auVar47 = vfmadd213ss_avx512f(auVar47,auVar52,auVar169);
          auVar38 = auVar47;
        }
        else if ((fVar94 != 0.0) ||
                (auVar47 = auVar42, auVar38 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar94))) {
          auVar47 = SUB6416(ZEXT464(0xff800000),0);
          auVar38 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar45 = vminss_avx(auVar45,auVar38);
        auVar44 = vmaxss_avx(auVar47,auVar44);
      }
      bVar36 = auVar88._0_4_ != fVar198;
      auVar47 = vminss_avx512f(auVar45,auVar42);
      auVar91._16_16_ = auVar75._16_16_;
      auVar91._0_16_ = auVar45;
      auVar90._4_28_ = auVar91._4_28_;
      auVar90._0_4_ = (uint)bVar36 * auVar47._0_4_ + (uint)!bVar36 * auVar45._0_4_;
      auVar47 = vmaxss_avx512f(auVar42,auVar44);
      auVar93._16_16_ = auVar75._16_16_;
      auVar93._0_16_ = auVar44;
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (uint)bVar36 * auVar47._0_4_ + (uint)!bVar36 * auVar44._0_4_;
      auVar47 = vmaxss_avx512f(auVar52,auVar90._0_16_);
      auVar38 = vminss_avx512f(auVar92._0_16_,auVar42);
    } while (auVar38._0_4_ < auVar47._0_4_);
    auVar51 = vmaxss_avx512f(auVar52,ZEXT416((uint)(auVar47._0_4_ + -0.1)));
    auVar50 = vminss_avx512f(ZEXT416((uint)(auVar38._0_4_ + 0.1)),auVar42);
    auVar114._0_8_ = auVar57._0_8_;
    auVar114._8_8_ = auVar114._0_8_;
    auVar190._8_8_ = auVar148._0_8_;
    auVar190._0_8_ = auVar148._0_8_;
    auVar206._8_8_ = auVar53._0_8_;
    auVar206._0_8_ = auVar53._0_8_;
    auVar47 = vshufpd_avx(auVar148,auVar148,3);
    auVar38 = vshufpd_avx(auVar53,auVar53,3);
    auVar39 = vshufps_avx(auVar51,auVar50,0);
    auVar53 = vsubps_avx512vl(auVar48,auVar39);
    fVar94 = auVar39._0_4_;
    auVar142._0_4_ = fVar94 * auVar40._0_4_;
    fVar197 = auVar39._4_4_;
    auVar142._4_4_ = fVar197 * auVar40._4_4_;
    fVar198 = auVar39._8_4_;
    auVar142._8_4_ = fVar198 * auVar40._8_4_;
    fVar199 = auVar39._12_4_;
    auVar142._12_4_ = fVar199 * auVar40._12_4_;
    auVar149._0_4_ = fVar94 * auVar47._0_4_;
    auVar149._4_4_ = fVar197 * auVar47._4_4_;
    auVar149._8_4_ = fVar198 * auVar47._8_4_;
    auVar149._12_4_ = fVar199 * auVar47._12_4_;
    auVar222._0_4_ = auVar38._0_4_ * fVar94;
    auVar222._4_4_ = auVar38._4_4_ * fVar197;
    auVar222._8_4_ = auVar38._8_4_ * fVar198;
    auVar222._12_4_ = auVar38._12_4_ * fVar199;
    auVar130._0_4_ = fVar94 * auVar41._0_4_;
    auVar130._4_4_ = fVar197 * auVar41._4_4_;
    auVar130._8_4_ = fVar198 * auVar41._8_4_;
    auVar130._12_4_ = fVar199 * auVar41._12_4_;
    auVar41 = vfmadd231ps_fma(auVar142,auVar53,auVar114);
    auVar44 = vfmadd231ps_fma(auVar149,auVar53,auVar190);
    auVar45 = vfmadd231ps_fma(auVar222,auVar53,auVar206);
    auVar53 = vfmadd231ps_fma(auVar130,auVar53,ZEXT816(0));
    auVar38 = vsubss_avx512f(auVar42,auVar51);
    auVar47 = vmovshdup_avx(auVar43);
    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar51._0_4_)),auVar43,auVar38);
    auVar38 = vsubss_avx512f(auVar42,auVar50);
    auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar50._0_4_)),auVar43,auVar38);
    auVar43 = vdivss_avx512f(auVar42,ZEXT416((uint)fVar202));
    auVar47 = vsubps_avx(auVar44,auVar41);
    auVar39 = vmulps_avx512vl(auVar47,auVar46);
    auVar47 = vsubps_avx(auVar45,auVar44);
    auVar40 = vmulps_avx512vl(auVar47,auVar46);
    auVar47 = vsubps_avx(auVar53,auVar45);
    auVar47 = vmulps_avx512vl(auVar47,auVar46);
    auVar38 = vminps_avx(auVar40,auVar47);
    auVar47 = vmaxps_avx(auVar40,auVar47);
    auVar38 = vminps_avx(auVar39,auVar38);
    auVar47 = vmaxps_avx(auVar39,auVar47);
    auVar39 = vshufpd_avx(auVar38,auVar38,3);
    auVar40 = vshufpd_avx(auVar47,auVar47,3);
    auVar38 = vminps_avx(auVar38,auVar39);
    auVar47 = vmaxps_avx(auVar47,auVar40);
    fVar202 = auVar43._0_4_;
    auVar170._0_4_ = auVar38._0_4_ * fVar202;
    auVar170._4_4_ = auVar38._4_4_ * fVar202;
    auVar170._8_4_ = auVar38._8_4_ * fVar202;
    auVar170._12_4_ = auVar38._12_4_ * fVar202;
    auVar158._0_4_ = fVar202 * auVar47._0_4_;
    auVar158._4_4_ = fVar202 * auVar47._4_4_;
    auVar158._8_4_ = fVar202 * auVar47._8_4_;
    auVar158._12_4_ = fVar202 * auVar47._12_4_;
    auVar51 = vdivss_avx512f(auVar42,ZEXT416((uint)(auVar50._0_4_ - auVar49._0_4_)));
    auVar47 = vshufpd_avx(auVar41,auVar41,3);
    auVar38 = vshufpd_avx(auVar44,auVar44,3);
    auVar39 = vshufpd_avx(auVar45,auVar45,3);
    auVar40 = vshufpd_avx(auVar53,auVar53,3);
    auVar47 = vsubps_avx(auVar47,auVar41);
    auVar41 = vsubps_avx(auVar38,auVar44);
    auVar43 = vsubps_avx(auVar39,auVar45);
    auVar40 = vsubps_avx(auVar40,auVar53);
    auVar38 = vminps_avx(auVar47,auVar41);
    auVar47 = vmaxps_avx(auVar47,auVar41);
    auVar39 = vminps_avx(auVar43,auVar40);
    auVar39 = vminps_avx(auVar38,auVar39);
    auVar38 = vmaxps_avx(auVar43,auVar40);
    auVar47 = vmaxps_avx(auVar47,auVar38);
    fVar202 = auVar51._0_4_;
    auVar207._0_4_ = fVar202 * auVar39._0_4_;
    auVar207._4_4_ = fVar202 * auVar39._4_4_;
    auVar207._8_4_ = fVar202 * auVar39._8_4_;
    auVar207._12_4_ = fVar202 * auVar39._12_4_;
    auVar191._0_4_ = fVar202 * auVar47._0_4_;
    auVar191._4_4_ = fVar202 * auVar47._4_4_;
    auVar191._8_4_ = fVar202 * auVar47._8_4_;
    auVar191._12_4_ = fVar202 * auVar47._12_4_;
    auVar40 = vinsertps_avx(auVar37,auVar49,0x10);
    auVar54 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9f90,auVar50);
    auVar104._0_4_ = auVar40._0_4_ + auVar54._0_4_;
    auVar104._4_4_ = auVar40._4_4_ + auVar54._4_4_;
    auVar104._8_4_ = auVar40._8_4_ + auVar54._8_4_;
    auVar104._12_4_ = auVar40._12_4_ + auVar54._12_4_;
    auVar15._8_4_ = 0x3f000000;
    auVar15._0_8_ = 0x3f0000003f000000;
    auVar15._12_4_ = 0x3f000000;
    auVar53 = vmulps_avx512vl(auVar104,auVar15);
    auVar38 = vshufps_avx(auVar53,auVar53,0x54);
    uVar95 = auVar53._0_4_;
    auVar107._4_4_ = uVar95;
    auVar107._0_4_ = uVar95;
    auVar107._8_4_ = uVar95;
    auVar107._12_4_ = uVar95;
    auVar43 = vfmadd213ps_avx512vl(auVar236._0_16_,auVar107,local_318);
    auVar39 = vfmadd213ps_fma(local_e8,auVar107,local_278);
    auVar41 = vfmadd213ps_fma(local_f8,auVar107,local_288);
    auVar47 = vsubps_avx(auVar39,auVar43);
    auVar43 = vfmadd213ps_fma(auVar47,auVar107,auVar43);
    auVar47 = vsubps_avx(auVar41,auVar39);
    auVar47 = vfmadd213ps_fma(auVar47,auVar107,auVar39);
    auVar47 = vsubps_avx(auVar47,auVar43);
    auVar39 = vfmadd231ps_fma(auVar43,auVar47,auVar107);
    auVar44 = vmulps_avx512vl(auVar47,auVar46);
    auVar214._8_8_ = auVar39._0_8_;
    auVar214._0_8_ = auVar39._0_8_;
    auVar47 = vshufpd_avx(auVar39,auVar39,3);
    auVar39 = vshufps_avx(auVar53,auVar53,0x55);
    auVar41 = vsubps_avx(auVar47,auVar214);
    auVar43 = vfmadd231ps_fma(auVar214,auVar39,auVar41);
    auVar223._8_8_ = auVar44._0_8_;
    auVar223._0_8_ = auVar44._0_8_;
    auVar47 = vshufpd_avx(auVar44,auVar44,3);
    auVar47 = vsubps_avx512vl(auVar47,auVar223);
    auVar47 = vfmadd213ps_avx512vl(auVar47,auVar39,auVar223);
    auVar108._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
    auVar108._8_4_ = auVar41._8_4_ ^ 0x80000000;
    auVar108._12_4_ = auVar41._12_4_ ^ 0x80000000;
    auVar39 = vmovshdup_avx512vl(auVar47);
    auVar224._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
    auVar224._8_4_ = auVar39._8_4_ ^ 0x80000000;
    auVar224._12_4_ = auVar39._12_4_ ^ 0x80000000;
    auVar44 = vmovshdup_avx512vl(auVar41);
    auVar45 = vpermt2ps_avx512vl(auVar224,ZEXT416(5),auVar41);
    auVar235 = ZEXT1664(local_318);
    auVar39 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar39._0_4_ * auVar41._0_4_)),auVar47,auVar44);
    auVar41 = vpermt2ps_avx512vl(auVar47,SUB6416(ZEXT464(4),0),auVar108);
    auVar131._0_4_ = auVar39._0_4_;
    auVar131._4_4_ = auVar131._0_4_;
    auVar131._8_4_ = auVar131._0_4_;
    auVar131._12_4_ = auVar131._0_4_;
    auVar47 = vdivps_avx(auVar45,auVar131);
    auVar55 = vdivps_avx512vl(auVar41,auVar131);
    fVar202 = auVar43._0_4_;
    auVar39 = vshufps_avx(auVar43,auVar43,0x55);
    auVar215._0_4_ = fVar202 * auVar47._0_4_ + auVar39._0_4_ * auVar55._0_4_;
    auVar215._4_4_ = fVar202 * auVar47._4_4_ + auVar39._4_4_ * auVar55._4_4_;
    auVar215._8_4_ = fVar202 * auVar47._8_4_ + auVar39._8_4_ * auVar55._8_4_;
    auVar215._12_4_ = fVar202 * auVar47._12_4_ + auVar39._12_4_ * auVar55._12_4_;
    auVar51 = vsubps_avx(auVar38,auVar215);
    auVar39 = vmovshdup_avx(auVar47);
    auVar38 = vinsertps_avx(auVar170,auVar207,0x1c);
    auVar225._0_4_ = auVar39._0_4_ * auVar38._0_4_;
    auVar225._4_4_ = auVar39._4_4_ * auVar38._4_4_;
    auVar225._8_4_ = auVar39._8_4_ * auVar38._8_4_;
    auVar225._12_4_ = auVar39._12_4_ * auVar38._12_4_;
    auVar57 = vinsertps_avx512f(auVar158,auVar191,0x1c);
    auVar39 = vmulps_avx512vl(auVar39,auVar57);
    auVar45 = vminps_avx512vl(auVar225,auVar39);
    auVar43 = vmaxps_avx(auVar39,auVar225);
    auVar44 = vmovshdup_avx(auVar55);
    auVar39 = vinsertps_avx(auVar207,auVar170,0x4c);
    auVar208._0_4_ = auVar44._0_4_ * auVar39._0_4_;
    auVar208._4_4_ = auVar44._4_4_ * auVar39._4_4_;
    auVar208._8_4_ = auVar44._8_4_ * auVar39._8_4_;
    auVar208._12_4_ = auVar44._12_4_ * auVar39._12_4_;
    auVar41 = vinsertps_avx(auVar191,auVar158,0x4c);
    auVar192._0_4_ = auVar44._0_4_ * auVar41._0_4_;
    auVar192._4_4_ = auVar44._4_4_ * auVar41._4_4_;
    auVar192._8_4_ = auVar44._8_4_ * auVar41._8_4_;
    auVar192._12_4_ = auVar44._12_4_ * auVar41._12_4_;
    auVar44 = vminps_avx(auVar208,auVar192);
    auVar45 = vaddps_avx512vl(auVar45,auVar44);
    auVar44 = vmaxps_avx(auVar192,auVar208);
    auVar193._0_4_ = auVar43._0_4_ + auVar44._0_4_;
    auVar193._4_4_ = auVar43._4_4_ + auVar44._4_4_;
    auVar193._8_4_ = auVar43._8_4_ + auVar44._8_4_;
    auVar193._12_4_ = auVar43._12_4_ + auVar44._12_4_;
    auVar209._8_8_ = 0x3f80000000000000;
    auVar209._0_8_ = 0x3f80000000000000;
    auVar43 = vsubps_avx(auVar209,auVar193);
    auVar44 = vsubps_avx(auVar209,auVar45);
    auVar45 = vsubps_avx(auVar40,auVar53);
    auVar53 = vsubps_avx(auVar54,auVar53);
    fVar199 = auVar45._0_4_;
    auVar226._0_4_ = fVar199 * auVar43._0_4_;
    fVar200 = auVar45._4_4_;
    auVar226._4_4_ = fVar200 * auVar43._4_4_;
    fVar201 = auVar45._8_4_;
    auVar226._8_4_ = fVar201 * auVar43._8_4_;
    fVar103 = auVar45._12_4_;
    auVar226._12_4_ = fVar103 * auVar43._12_4_;
    auVar56 = vbroadcastss_avx512vl(auVar47);
    auVar38 = vmulps_avx512vl(auVar56,auVar38);
    auVar57 = vmulps_avx512vl(auVar56,auVar57);
    auVar56 = vminps_avx512vl(auVar38,auVar57);
    auVar57 = vmaxps_avx512vl(auVar57,auVar38);
    auVar38 = vbroadcastss_avx512vl(auVar55);
    auVar39 = vmulps_avx512vl(auVar38,auVar39);
    auVar38 = vmulps_avx512vl(auVar38,auVar41);
    auVar41 = vminps_avx512vl(auVar39,auVar38);
    auVar41 = vaddps_avx512vl(auVar56,auVar41);
    auVar45 = vmulps_avx512vl(auVar45,auVar44);
    in_ZMM17 = ZEXT1664(auVar45);
    fVar202 = auVar53._0_4_;
    auVar194._0_4_ = fVar202 * auVar43._0_4_;
    fVar94 = auVar53._4_4_;
    auVar194._4_4_ = fVar94 * auVar43._4_4_;
    fVar197 = auVar53._8_4_;
    auVar194._8_4_ = fVar197 * auVar43._8_4_;
    fVar198 = auVar53._12_4_;
    auVar194._12_4_ = fVar198 * auVar43._12_4_;
    auVar210._0_4_ = fVar202 * auVar44._0_4_;
    auVar210._4_4_ = fVar94 * auVar44._4_4_;
    auVar210._8_4_ = fVar197 * auVar44._8_4_;
    auVar210._12_4_ = fVar198 * auVar44._12_4_;
    auVar38 = vmaxps_avx(auVar38,auVar39);
    auVar159._0_4_ = auVar57._0_4_ + auVar38._0_4_;
    auVar159._4_4_ = auVar57._4_4_ + auVar38._4_4_;
    auVar159._8_4_ = auVar57._8_4_ + auVar38._8_4_;
    auVar159._12_4_ = auVar57._12_4_ + auVar38._12_4_;
    auVar171._8_8_ = 0x3f800000;
    auVar171._0_8_ = 0x3f800000;
    auVar38 = vsubps_avx(auVar171,auVar159);
    auVar39 = vsubps_avx512vl(auVar171,auVar41);
    auVar220._0_4_ = fVar199 * auVar38._0_4_;
    auVar220._4_4_ = fVar200 * auVar38._4_4_;
    auVar220._8_4_ = fVar201 * auVar38._8_4_;
    auVar220._12_4_ = fVar103 * auVar38._12_4_;
    auVar216._0_4_ = fVar199 * auVar39._0_4_;
    auVar216._4_4_ = fVar200 * auVar39._4_4_;
    auVar216._8_4_ = fVar201 * auVar39._8_4_;
    auVar216._12_4_ = fVar103 * auVar39._12_4_;
    auVar160._0_4_ = fVar202 * auVar38._0_4_;
    auVar160._4_4_ = fVar94 * auVar38._4_4_;
    auVar160._8_4_ = fVar197 * auVar38._8_4_;
    auVar160._12_4_ = fVar198 * auVar38._12_4_;
    auVar172._0_4_ = fVar202 * auVar39._0_4_;
    auVar172._4_4_ = fVar94 * auVar39._4_4_;
    auVar172._8_4_ = fVar197 * auVar39._8_4_;
    auVar172._12_4_ = fVar198 * auVar39._12_4_;
    auVar38 = vminps_avx(auVar220,auVar216);
    auVar39 = vminps_avx512vl(auVar160,auVar172);
    auVar41 = vminps_avx512vl(auVar38,auVar39);
    auVar38 = vmaxps_avx(auVar216,auVar220);
    auVar39 = vmaxps_avx(auVar172,auVar160);
    auVar39 = vmaxps_avx(auVar39,auVar38);
    auVar43 = vminps_avx512vl(auVar226,auVar45);
    auVar38 = vminps_avx(auVar194,auVar210);
    auVar38 = vminps_avx(auVar43,auVar38);
    auVar38 = vhaddps_avx(auVar41,auVar38);
    auVar43 = vmaxps_avx512vl(auVar45,auVar226);
    auVar41 = vmaxps_avx(auVar210,auVar194);
    auVar41 = vmaxps_avx(auVar41,auVar43);
    auVar39 = vhaddps_avx(auVar39,auVar41);
    auVar38 = vshufps_avx(auVar38,auVar38,0xe8);
    auVar39 = vshufps_avx(auVar39,auVar39,0xe8);
    auVar161._0_4_ = auVar38._0_4_ + auVar51._0_4_;
    auVar161._4_4_ = auVar38._4_4_ + auVar51._4_4_;
    auVar161._8_4_ = auVar38._8_4_ + auVar51._8_4_;
    auVar161._12_4_ = auVar38._12_4_ + auVar51._12_4_;
    auVar173._0_4_ = auVar39._0_4_ + auVar51._0_4_;
    auVar173._4_4_ = auVar39._4_4_ + auVar51._4_4_;
    auVar173._8_4_ = auVar39._8_4_ + auVar51._8_4_;
    auVar173._12_4_ = auVar39._12_4_ + auVar51._12_4_;
    auVar38 = vmaxps_avx(auVar40,auVar161);
    auVar39 = vminps_avx(auVar173,auVar54);
    uVar1 = vcmpps_avx512vl(auVar39,auVar38,1);
  } while ((uVar1 & 3) != 0);
  uVar1 = vcmpps_avx512vl(auVar173,auVar54,1);
  uVar11 = vcmpps_avx512vl(auVar37,auVar161,1);
  if (((ushort)uVar11 & (ushort)uVar1 & 1) == 0) {
    bVar24 = 0;
  }
  else {
    auVar38 = vmovshdup_avx(auVar161);
    bVar24 = auVar49._0_4_ < auVar38._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar26 || uVar6 != 0 && !bVar35) | bVar24) != 1) goto LAB_01a2b863;
  lVar28 = 0xc9;
  do {
    lVar28 = lVar28 + -1;
    if (lVar28 == 0) goto LAB_01a2aa21;
    auVar37 = vsubss_avx512f(auVar42,auVar51);
    fVar197 = auVar37._0_4_;
    fVar202 = fVar197 * fVar197 * fVar197;
    fVar198 = auVar51._0_4_;
    fVar94 = fVar198 * 3.0 * fVar197 * fVar197;
    fVar197 = fVar197 * fVar198 * fVar198 * 3.0;
    auVar120._4_4_ = fVar202;
    auVar120._0_4_ = fVar202;
    auVar120._8_4_ = fVar202;
    auVar120._12_4_ = fVar202;
    auVar115._4_4_ = fVar94;
    auVar115._0_4_ = fVar94;
    auVar115._8_4_ = fVar94;
    auVar115._12_4_ = fVar94;
    auVar97._4_4_ = fVar197;
    auVar97._0_4_ = fVar197;
    auVar97._8_4_ = fVar197;
    auVar97._12_4_ = fVar197;
    fVar198 = fVar198 * fVar198 * fVar198;
    auVar143._0_4_ = (float)local_108._0_4_ * fVar198;
    auVar143._4_4_ = (float)local_108._4_4_ * fVar198;
    auVar143._8_4_ = fStack_100 * fVar198;
    auVar143._12_4_ = fStack_fc * fVar198;
    auVar37 = vfmadd231ps_fma(auVar143,local_288,auVar97);
    auVar37 = vfmadd231ps_fma(auVar37,local_278,auVar115);
    auVar37 = vfmadd231ps_avx512vl(auVar37,local_318,auVar120);
    auVar98._8_8_ = auVar37._0_8_;
    auVar98._0_8_ = auVar37._0_8_;
    auVar37 = vshufpd_avx(auVar37,auVar37,3);
    auVar38 = vshufps_avx(auVar51,auVar51,0x55);
    auVar37 = vsubps_avx(auVar37,auVar98);
    auVar38 = vfmadd213ps_fma(auVar37,auVar38,auVar98);
    fVar202 = auVar38._0_4_;
    auVar37 = vshufps_avx(auVar38,auVar38,0x55);
    auVar99._0_4_ = auVar47._0_4_ * fVar202 + auVar55._0_4_ * auVar37._0_4_;
    auVar99._4_4_ = auVar47._4_4_ * fVar202 + auVar55._4_4_ * auVar37._4_4_;
    auVar99._8_4_ = auVar47._8_4_ * fVar202 + auVar55._8_4_ * auVar37._8_4_;
    auVar99._12_4_ = auVar47._12_4_ * fVar202 + auVar55._12_4_ * auVar37._12_4_;
    auVar51 = vsubps_avx(auVar51,auVar99);
    auVar37 = vandps_avx512vl(auVar38,auVar229._0_16_);
    auVar38 = vprolq_avx512vl(auVar37,0x20);
    auVar37 = vmaxss_avx(auVar38,auVar37);
    bVar35 = (float)local_118._0_4_ < auVar37._0_4_;
  } while ((float)local_118._0_4_ <= auVar37._0_4_);
  auVar37 = vucomiss_avx512f(auVar52);
  if (bVar35) goto LAB_01a2aa21;
  auVar47 = vucomiss_avx512f(auVar37);
  auVar238 = ZEXT1664(auVar47);
  if (bVar35) goto LAB_01a2aa21;
  vmovshdup_avx(auVar37);
  auVar47 = vucomiss_avx512f(auVar52);
  if (bVar35) goto LAB_01a2aa21;
  auVar42 = vucomiss_avx512f(auVar47);
  auVar238 = ZEXT1664(auVar42);
  if (bVar35) goto LAB_01a2aa21;
  auVar38 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar53 = vinsertps_avx(auVar38,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar2 = (ray->org).field_0;
  auVar38 = vsubps_avx(local_1a8,(undefined1  [16])aVar2);
  auVar38 = vdpps_avx(auVar38,auVar53,0x7f);
  auVar39 = vsubps_avx(local_1e8,(undefined1  [16])aVar2);
  auVar39 = vdpps_avx(auVar39,auVar53,0x7f);
  auVar40 = vsubps_avx(local_1f8,(undefined1  [16])aVar2);
  auVar40 = vdpps_avx(auVar40,auVar53,0x7f);
  auVar41 = vsubps_avx(local_1c8,(undefined1  [16])aVar2);
  auVar41 = vdpps_avx(auVar41,auVar53,0x7f);
  auVar43 = vsubps_avx(_local_1b8,(undefined1  [16])aVar2);
  auVar43 = vdpps_avx(auVar43,auVar53,0x7f);
  auVar44 = vsubps_avx(_local_208,(undefined1  [16])aVar2);
  auVar44 = vdpps_avx(auVar44,auVar53,0x7f);
  auVar45 = vsubps_avx(_local_218,(undefined1  [16])aVar2);
  auVar45 = vdpps_avx(auVar45,auVar53,0x7f);
  auVar51 = vsubps_avx(_local_1d8,(undefined1  [16])aVar2);
  auVar53 = vdpps_avx(auVar51,auVar53,0x7f);
  auVar51 = vsubss_avx512f(auVar42,auVar47);
  fVar202 = auVar47._0_4_;
  auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar202)),auVar51,auVar38);
  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar202)),auVar51,auVar39);
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar202)),auVar51,auVar40);
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar53._0_4_)),auVar51,auVar41);
  auVar42 = vsubss_avx512f(auVar42,auVar37);
  auVar144._0_4_ = auVar42._0_4_;
  fVar202 = auVar144._0_4_ * auVar144._0_4_ * auVar144._0_4_;
  fVar199 = auVar37._0_4_;
  fVar94 = fVar199 * 3.0 * auVar144._0_4_ * auVar144._0_4_;
  fVar197 = auVar144._0_4_ * fVar199 * fVar199 * 3.0;
  fVar200 = fVar199 * fVar199 * fVar199;
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar40._0_4_)),ZEXT416((uint)fVar197),auVar39)
  ;
  auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar94),auVar38);
  auVar47 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar202),auVar47);
  fVar198 = auVar47._0_4_;
  if ((fVar198 < (ray->org).field_0.m128[3]) || (local_33c = ray->tfar, local_33c < fVar198))
  goto LAB_01a2aa21;
  auVar47 = vshufps_avx(auVar37,auVar37,0x55);
  auVar38 = vsubps_avx512vl(auVar48,auVar47);
  fVar201 = auVar47._0_4_;
  auVar174._0_4_ = fVar201 * (float)local_1b8._0_4_;
  fVar103 = auVar47._4_4_;
  auVar174._4_4_ = fVar103 * (float)local_1b8._4_4_;
  fVar105 = auVar47._8_4_;
  auVar174._8_4_ = fVar105 * fStack_1b0;
  fVar100 = auVar47._12_4_;
  auVar174._12_4_ = fVar100 * fStack_1ac;
  auVar180._0_4_ = fVar201 * (float)local_208._0_4_;
  auVar180._4_4_ = fVar103 * (float)local_208._4_4_;
  auVar180._8_4_ = fVar105 * fStack_200;
  auVar180._12_4_ = fVar100 * fStack_1fc;
  auVar195._0_4_ = fVar201 * (float)local_218._0_4_;
  auVar195._4_4_ = fVar103 * (float)local_218._4_4_;
  auVar195._8_4_ = fVar105 * fStack_210;
  auVar195._12_4_ = fVar100 * fStack_20c;
  auVar150._0_4_ = fVar201 * (float)local_1d8._0_4_;
  auVar150._4_4_ = fVar103 * (float)local_1d8._4_4_;
  auVar150._8_4_ = fVar105 * fStack_1d0;
  auVar150._12_4_ = fVar100 * fStack_1cc;
  auVar47 = vfmadd231ps_fma(auVar174,auVar38,local_1a8);
  auVar48 = vfmadd231ps_fma(auVar180,auVar38,local_1e8);
  auVar42 = vfmadd231ps_fma(auVar195,auVar38,local_1f8);
  auVar38 = vfmadd231ps_fma(auVar150,auVar38,local_1c8);
  auVar47 = vsubps_avx(auVar48,auVar47);
  auVar48 = vsubps_avx(auVar42,auVar48);
  auVar42 = vsubps_avx(auVar38,auVar42);
  auVar196._0_4_ = fVar199 * auVar48._0_4_;
  auVar196._4_4_ = fVar199 * auVar48._4_4_;
  auVar196._8_4_ = fVar199 * auVar48._8_4_;
  auVar196._12_4_ = fVar199 * auVar48._12_4_;
  auVar144._4_4_ = auVar144._0_4_;
  auVar144._8_4_ = auVar144._0_4_;
  auVar144._12_4_ = auVar144._0_4_;
  auVar47 = vfmadd231ps_fma(auVar196,auVar144,auVar47);
  auVar151._0_4_ = fVar199 * auVar42._0_4_;
  auVar151._4_4_ = fVar199 * auVar42._4_4_;
  auVar151._8_4_ = fVar199 * auVar42._8_4_;
  auVar151._12_4_ = fVar199 * auVar42._12_4_;
  auVar48 = vfmadd231ps_fma(auVar151,auVar144,auVar48);
  auVar152._0_4_ = fVar199 * auVar48._0_4_;
  auVar152._4_4_ = fVar199 * auVar48._4_4_;
  auVar152._8_4_ = fVar199 * auVar48._8_4_;
  auVar152._12_4_ = fVar199 * auVar48._12_4_;
  auVar47 = vfmadd231ps_fma(auVar152,auVar144,auVar47);
  auVar46 = vmulps_avx512vl(auVar47,auVar46);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  if ((pGVar7->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar24 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01a2b847;
    auVar132._0_4_ = fVar200 * (float)local_158._0_4_;
    auVar132._4_4_ = fVar200 * (float)local_158._4_4_;
    auVar132._8_4_ = fVar200 * fStack_150;
    auVar132._12_4_ = fVar200 * fStack_14c;
    auVar121._4_4_ = fVar197;
    auVar121._0_4_ = fVar197;
    auVar121._8_4_ = fVar197;
    auVar121._12_4_ = fVar197;
    auVar47 = vfmadd132ps_fma(auVar121,auVar132,local_148);
    auVar116._4_4_ = fVar94;
    auVar116._0_4_ = fVar94;
    auVar116._8_4_ = fVar94;
    auVar116._12_4_ = fVar94;
    auVar47 = vfmadd132ps_fma(auVar116,auVar47,local_138);
    auVar109._4_4_ = fVar202;
    auVar109._0_4_ = fVar202;
    auVar109._8_4_ = fVar202;
    auVar109._12_4_ = fVar202;
    auVar42 = vfmadd132ps_fma(auVar109,auVar47,local_128);
    auVar47 = vshufps_avx(auVar42,auVar42,0xc9);
    auVar48 = vshufps_avx(auVar46,auVar46,0xc9);
    auVar110._0_4_ = auVar42._0_4_ * auVar48._0_4_;
    auVar110._4_4_ = auVar42._4_4_ * auVar48._4_4_;
    auVar110._8_4_ = auVar42._8_4_ * auVar48._8_4_;
    auVar110._12_4_ = auVar42._12_4_ * auVar48._12_4_;
    auVar47 = vfmsub231ps_fma(auVar110,auVar46,auVar47);
    auVar46 = vshufps_avx(auVar47,auVar47,0xe9);
    local_188 = vmovlps_avx(auVar46);
    local_180 = auVar47._0_4_;
    local_17c = vmovlps_avx(auVar37);
    local_174 = (int)local_250;
    local_170 = uVar5;
    local_16c = context->user->instID[0];
    local_168 = context->user->instPrimID[0];
    ray->tfar = fVar198;
    local_340 = -1;
    local_248.geometryUserPtr = pGVar7->userPtr;
    local_248.context = context->user;
    local_248.hit = (RTCHitN *)&local_188;
    local_248.N = 1;
    local_248.ray = (RTCRayN *)ray;
    if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a2b76e:
      p_Var10 = context->args->filter;
      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var10)(&local_248);
        auVar236 = ZEXT1664(local_338);
        auVar238 = ZEXT464(0x3f800000);
        auVar234 = ZEXT3264(_DAT_01fb9fe0);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar233 = ZEXT1664(auVar37);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar232 = ZEXT1664(auVar37);
        auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar231 = ZEXT3264(auVar63);
        auVar75._16_16_ = auVar63._16_16_;
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar230 = ZEXT1664(auVar37);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar229 = ZEXT1664(auVar37);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar228 = ZEXT1664(auVar37);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
        auVar239 = ZEXT1664(auVar37);
        if (*local_248.valid == 0) goto LAB_01a2b838;
      }
      bVar24 = 1;
      goto LAB_01a2b847;
    }
    local_260 = context;
    (*pGVar7->occlusionFilterN)(&local_248);
    auVar236 = ZEXT1664(local_338);
    auVar238 = ZEXT464(0x3f800000);
    auVar234 = ZEXT3264(_DAT_01fb9fe0);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar233 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar232 = ZEXT1664(auVar37);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar231 = ZEXT3264(auVar63);
    auVar75._16_16_ = auVar63._16_16_;
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar230 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar229 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar228 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
    auVar239 = ZEXT1664(auVar37);
    context = local_260;
    if (*local_248.valid != 0) goto LAB_01a2b76e;
LAB_01a2b838:
    auVar238 = ZEXT464(0x3f800000);
    ray->tfar = local_33c;
  }
  bVar24 = 0;
LAB_01a2b847:
  bVar32 = (bool)(bVar32 | bVar24);
  pre = local_258;
  goto LAB_01a2aa21;
LAB_01a2b863:
  auVar43 = vinsertps_avx(auVar49,auVar50,0x10);
  goto LAB_01a2a524;
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }